

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<8,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Primitive PVar11;
  int iVar12;
  Geometry *pGVar13;
  __int_type_conflict _Var14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined8 uVar24;
  long lVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  ulong uVar82;
  RayK<8> *pRVar83;
  byte bVar84;
  ulong uVar85;
  ulong uVar86;
  long lVar87;
  ulong uVar88;
  bool bVar89;
  uint uVar90;
  Geometry *geometry;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  long lVar91;
  float fVar92;
  float fVar137;
  float fVar139;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar98 [16];
  float fVar138;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar143;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar144;
  undefined4 uVar145;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined8 uVar146;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  float fVar159;
  float fVar160;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar167;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar168;
  float fVar169;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [16];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  bool local_7d9;
  RTCFilterFunctionNArguments local_7a0;
  undefined1 local_770 [8];
  float fStack_768;
  float fStack_764;
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined8 uStack_758;
  undefined1 local_750 [16];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  float local_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined8 local_6a0;
  undefined8 uStack_698;
  LinearSpace3fa *local_690;
  Primitive *local_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined4 local_3c0;
  int local_3bc;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  byte local_370;
  float local_360 [4];
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar11 = prim[1];
  uVar82 = (ulong)(byte)PVar11;
  lVar25 = uVar82 * 0x25;
  fVar169 = *(float *)(prim + lVar25 + 0x12);
  auVar93 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar96 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar97 = vsubps_avx(auVar93,*(undefined1 (*) [16])(prim + lVar25 + 6));
  fVar159 = fVar169 * auVar97._0_4_;
  fVar144 = fVar169 * auVar96._0_4_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar82 * 4 + 6);
  auVar103 = vpmovsxbd_avx2(auVar93);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar82 * 5 + 6);
  auVar102 = vpmovsxbd_avx2(auVar94);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar82 * 6 + 6);
  auVar114 = vpmovsxbd_avx2(auVar95);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar82 * 0xf + 6);
  auVar113 = vpmovsxbd_avx2(auVar6);
  auVar210._8_8_ = 0;
  auVar210._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + 6);
  auVar107 = vpmovsxbd_avx2(auVar210);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar104 = vcvtdq2ps_avx(auVar107);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar82 + 6);
  auVar105 = vpmovsxbd_avx2(auVar7);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar82 * 0x1a + 6);
  auVar112 = vpmovsxbd_avx2(auVar8);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar82 * 0x1b + 6);
  auVar106 = vpmovsxbd_avx2(auVar9);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar82 * 0x1c + 6);
  auVar101 = vpmovsxbd_avx2(auVar10);
  auVar108 = vcvtdq2ps_avx(auVar101);
  auVar181._4_4_ = fVar144;
  auVar181._0_4_ = fVar144;
  auVar181._8_4_ = fVar144;
  auVar181._12_4_ = fVar144;
  auVar181._16_4_ = fVar144;
  auVar181._20_4_ = fVar144;
  auVar181._24_4_ = fVar144;
  auVar181._28_4_ = fVar144;
  auVar202._8_4_ = 1;
  auVar202._0_8_ = 0x100000001;
  auVar202._12_4_ = 1;
  auVar202._16_4_ = 1;
  auVar202._20_4_ = 1;
  auVar202._24_4_ = 1;
  auVar202._28_4_ = 1;
  auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar110 = ZEXT1632(CONCAT412(fVar169 * auVar96._12_4_,
                                CONCAT48(fVar169 * auVar96._8_4_,
                                         CONCAT44(fVar169 * auVar96._4_4_,fVar144))));
  auVar109 = vpermps_avx2(auVar202,auVar110);
  auVar100 = vpermps_avx512vl(auVar99,auVar110);
  fVar168 = auVar100._0_4_;
  fVar176 = auVar100._4_4_;
  auVar110._4_4_ = fVar176 * auVar114._4_4_;
  auVar110._0_4_ = fVar168 * auVar114._0_4_;
  fVar177 = auVar100._8_4_;
  auVar110._8_4_ = fVar177 * auVar114._8_4_;
  fVar178 = auVar100._12_4_;
  auVar110._12_4_ = fVar178 * auVar114._12_4_;
  fVar160 = auVar100._16_4_;
  auVar110._16_4_ = fVar160 * auVar114._16_4_;
  fVar167 = auVar100._20_4_;
  auVar110._20_4_ = fVar167 * auVar114._20_4_;
  fVar92 = auVar100._24_4_;
  auVar110._24_4_ = fVar92 * auVar114._24_4_;
  auVar110._28_4_ = auVar107._28_4_;
  auVar107._4_4_ = auVar105._4_4_ * fVar176;
  auVar107._0_4_ = auVar105._0_4_ * fVar168;
  auVar107._8_4_ = auVar105._8_4_ * fVar177;
  auVar107._12_4_ = auVar105._12_4_ * fVar178;
  auVar107._16_4_ = auVar105._16_4_ * fVar160;
  auVar107._20_4_ = auVar105._20_4_ * fVar167;
  auVar107._24_4_ = auVar105._24_4_ * fVar92;
  auVar107._28_4_ = auVar101._28_4_;
  auVar101._4_4_ = auVar108._4_4_ * fVar176;
  auVar101._0_4_ = auVar108._0_4_ * fVar168;
  auVar101._8_4_ = auVar108._8_4_ * fVar177;
  auVar101._12_4_ = auVar108._12_4_ * fVar178;
  auVar101._16_4_ = auVar108._16_4_ * fVar160;
  auVar101._20_4_ = auVar108._20_4_ * fVar167;
  auVar101._24_4_ = auVar108._24_4_ * fVar92;
  auVar101._28_4_ = auVar100._28_4_;
  auVar93 = vfmadd231ps_fma(auVar110,auVar109,auVar102);
  auVar94 = vfmadd231ps_fma(auVar107,auVar109,auVar104);
  auVar95 = vfmadd231ps_fma(auVar101,auVar106,auVar109);
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar181,auVar103);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar181,auVar113);
  auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar112,auVar181);
  auVar199._4_4_ = fVar159;
  auVar199._0_4_ = fVar159;
  auVar199._8_4_ = fVar159;
  auVar199._12_4_ = fVar159;
  auVar199._16_4_ = fVar159;
  auVar199._20_4_ = fVar159;
  auVar199._24_4_ = fVar159;
  auVar199._28_4_ = fVar159;
  auVar101 = ZEXT1632(CONCAT412(fVar169 * auVar97._12_4_,
                                CONCAT48(fVar169 * auVar97._8_4_,
                                         CONCAT44(fVar169 * auVar97._4_4_,fVar159))));
  auVar107 = vpermps_avx2(auVar202,auVar101);
  auVar101 = vpermps_avx512vl(auVar99,auVar101);
  fVar169 = auVar101._0_4_;
  fVar168 = auVar101._4_4_;
  auVar109._4_4_ = fVar168 * auVar114._4_4_;
  auVar109._0_4_ = fVar169 * auVar114._0_4_;
  fVar176 = auVar101._8_4_;
  auVar109._8_4_ = fVar176 * auVar114._8_4_;
  fVar177 = auVar101._12_4_;
  auVar109._12_4_ = fVar177 * auVar114._12_4_;
  fVar178 = auVar101._16_4_;
  auVar109._16_4_ = fVar178 * auVar114._16_4_;
  fVar160 = auVar101._20_4_;
  auVar109._20_4_ = fVar160 * auVar114._20_4_;
  fVar167 = auVar101._24_4_;
  auVar109._24_4_ = fVar167 * auVar114._24_4_;
  auVar109._28_4_ = fVar144;
  auVar99._4_4_ = auVar105._4_4_ * fVar168;
  auVar99._0_4_ = auVar105._0_4_ * fVar169;
  auVar99._8_4_ = auVar105._8_4_ * fVar176;
  auVar99._12_4_ = auVar105._12_4_ * fVar177;
  auVar99._16_4_ = auVar105._16_4_ * fVar178;
  auVar99._20_4_ = auVar105._20_4_ * fVar160;
  auVar99._24_4_ = auVar105._24_4_ * fVar167;
  auVar99._28_4_ = auVar114._28_4_;
  auVar105._4_4_ = auVar108._4_4_ * fVar168;
  auVar105._0_4_ = auVar108._0_4_ * fVar169;
  auVar105._8_4_ = auVar108._8_4_ * fVar176;
  auVar105._12_4_ = auVar108._12_4_ * fVar177;
  auVar105._16_4_ = auVar108._16_4_ * fVar178;
  auVar105._20_4_ = auVar108._20_4_ * fVar160;
  auVar105._24_4_ = auVar108._24_4_ * fVar167;
  auVar105._28_4_ = auVar101._28_4_;
  auVar6 = vfmadd231ps_fma(auVar109,auVar107,auVar102);
  auVar210 = vfmadd231ps_fma(auVar99,auVar107,auVar104);
  auVar7 = vfmadd231ps_fma(auVar105,auVar107,auVar106);
  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar199,auVar103);
  auVar97 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar199,auVar113);
  auVar191._8_4_ = 0x7fffffff;
  auVar191._0_8_ = 0x7fffffff7fffffff;
  auVar191._12_4_ = 0x7fffffff;
  auVar191._16_4_ = 0x7fffffff;
  auVar191._20_4_ = 0x7fffffff;
  auVar191._24_4_ = 0x7fffffff;
  auVar191._28_4_ = 0x7fffffff;
  auVar152 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar199,auVar112);
  auVar103 = vandps_avx(auVar191,ZEXT1632(auVar93));
  auVar187._8_4_ = 0x219392ef;
  auVar187._0_8_ = 0x219392ef219392ef;
  auVar187._12_4_ = 0x219392ef;
  auVar187._16_4_ = 0x219392ef;
  auVar187._20_4_ = 0x219392ef;
  auVar187._24_4_ = 0x219392ef;
  auVar187._28_4_ = 0x219392ef;
  uVar85 = vcmpps_avx512vl(auVar103,auVar187,1);
  bVar89 = (bool)((byte)uVar85 & 1);
  auVar100._0_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar93._0_4_;
  bVar89 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar93._4_4_;
  bVar89 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar93._8_4_;
  bVar89 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar93._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar85 >> 7) * 0x219392ef;
  auVar103 = vandps_avx(auVar191,ZEXT1632(auVar94));
  uVar85 = vcmpps_avx512vl(auVar103,auVar187,1);
  bVar89 = (bool)((byte)uVar85 & 1);
  auVar111._0_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar94._0_4_;
  bVar89 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar111._4_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar94._4_4_;
  bVar89 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar111._8_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar94._8_4_;
  bVar89 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar111._12_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar94._12_4_;
  auVar111._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * 0x219392ef;
  auVar111._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * 0x219392ef;
  auVar111._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * 0x219392ef;
  auVar111._28_4_ = (uint)(byte)(uVar85 >> 7) * 0x219392ef;
  auVar103 = vandps_avx(auVar191,ZEXT1632(auVar95));
  uVar85 = vcmpps_avx512vl(auVar103,auVar187,1);
  bVar89 = (bool)((byte)uVar85 & 1);
  auVar103._0_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar95._0_4_;
  bVar89 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar95._4_4_;
  bVar89 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar95._8_4_;
  bVar89 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar89 * 0x219392ef | (uint)!bVar89 * auVar95._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar85 >> 7) * 0x219392ef;
  auVar102 = vrcp14ps_avx512vl(auVar100);
  auVar188._8_4_ = 0x3f800000;
  auVar188._0_8_ = &DAT_3f8000003f800000;
  auVar188._12_4_ = 0x3f800000;
  auVar188._16_4_ = 0x3f800000;
  auVar188._20_4_ = 0x3f800000;
  auVar188._24_4_ = 0x3f800000;
  auVar188._28_4_ = 0x3f800000;
  auVar93 = vfnmadd213ps_fma(auVar100,auVar102,auVar188);
  auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar111);
  auVar94 = vfnmadd213ps_fma(auVar111,auVar102,auVar188);
  auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar103);
  auVar95 = vfnmadd213ps_fma(auVar103,auVar102,auVar188);
  auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar102,auVar102);
  fVar169 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar25 + 0x16)) *
            *(float *)(prim + lVar25 + 0x1a);
  auVar184._4_4_ = fVar169;
  auVar184._0_4_ = fVar169;
  auVar184._8_4_ = fVar169;
  auVar184._12_4_ = fVar169;
  auVar184._16_4_ = fVar169;
  auVar184._20_4_ = fVar169;
  auVar184._24_4_ = fVar169;
  auVar184._28_4_ = fVar169;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 7 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 0xb + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 9 + 6));
  auVar6 = vfmadd213ps_fma(auVar102,auVar184,auVar103);
  auVar103 = vcvtdq2ps_avx(auVar114);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 0xd + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar210 = vfmadd213ps_fma(auVar102,auVar184,auVar103);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 0x12 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar85 = (ulong)(uint)((int)(uVar82 * 5) << 2);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 2 + uVar85 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar7 = vfmadd213ps_fma(auVar102,auVar184,auVar103);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 0x18 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar8 = vfmadd213ps_fma(auVar102,auVar184,auVar103);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 0x1d + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 + (ulong)(byte)PVar11 * 0x20 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar9 = vfmadd213ps_fma(auVar102,auVar184,auVar103);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar11 * 0x20 - uVar82) + 6)
                           );
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 0x23 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar10 = vfmadd213ps_fma(auVar102,auVar184,auVar103);
  auVar103 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar96));
  auVar112._4_4_ = auVar93._4_4_ * auVar103._4_4_;
  auVar112._0_4_ = auVar93._0_4_ * auVar103._0_4_;
  auVar112._8_4_ = auVar93._8_4_ * auVar103._8_4_;
  auVar112._12_4_ = auVar93._12_4_ * auVar103._12_4_;
  auVar112._16_4_ = auVar103._16_4_ * 0.0;
  auVar112._20_4_ = auVar103._20_4_ * 0.0;
  auVar112._24_4_ = auVar103._24_4_ * 0.0;
  auVar112._28_4_ = auVar103._28_4_;
  auVar103 = vsubps_avx(ZEXT1632(auVar210),ZEXT1632(auVar96));
  auVar158._0_4_ = auVar93._0_4_ * auVar103._0_4_;
  auVar158._4_4_ = auVar93._4_4_ * auVar103._4_4_;
  auVar158._8_4_ = auVar93._8_4_ * auVar103._8_4_;
  auVar158._12_4_ = auVar93._12_4_ * auVar103._12_4_;
  auVar158._16_4_ = auVar103._16_4_ * 0.0;
  auVar158._20_4_ = auVar103._20_4_ * 0.0;
  auVar158._24_4_ = auVar103._24_4_ * 0.0;
  auVar158._28_4_ = 0;
  auVar103 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar97));
  auVar106._4_4_ = auVar94._4_4_ * auVar103._4_4_;
  auVar106._0_4_ = auVar94._0_4_ * auVar103._0_4_;
  auVar106._8_4_ = auVar94._8_4_ * auVar103._8_4_;
  auVar106._12_4_ = auVar94._12_4_ * auVar103._12_4_;
  auVar106._16_4_ = auVar103._16_4_ * 0.0;
  auVar106._20_4_ = auVar103._20_4_ * 0.0;
  auVar106._24_4_ = auVar103._24_4_ * 0.0;
  auVar106._28_4_ = auVar103._28_4_;
  auVar103 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar97));
  auVar155._0_4_ = auVar94._0_4_ * auVar103._0_4_;
  auVar155._4_4_ = auVar94._4_4_ * auVar103._4_4_;
  auVar155._8_4_ = auVar94._8_4_ * auVar103._8_4_;
  auVar155._12_4_ = auVar94._12_4_ * auVar103._12_4_;
  auVar155._16_4_ = auVar103._16_4_ * 0.0;
  auVar155._20_4_ = auVar103._20_4_ * 0.0;
  auVar155._24_4_ = auVar103._24_4_ * 0.0;
  auVar155._28_4_ = 0;
  auVar103 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar152));
  auVar108._4_4_ = auVar95._4_4_ * auVar103._4_4_;
  auVar108._0_4_ = auVar95._0_4_ * auVar103._0_4_;
  auVar108._8_4_ = auVar95._8_4_ * auVar103._8_4_;
  auVar108._12_4_ = auVar95._12_4_ * auVar103._12_4_;
  auVar108._16_4_ = auVar103._16_4_ * 0.0;
  auVar108._20_4_ = auVar103._20_4_ * 0.0;
  auVar108._24_4_ = auVar103._24_4_ * 0.0;
  auVar108._28_4_ = auVar103._28_4_;
  auVar103 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar152));
  auVar126._0_4_ = auVar95._0_4_ * auVar103._0_4_;
  auVar126._4_4_ = auVar95._4_4_ * auVar103._4_4_;
  auVar126._8_4_ = auVar95._8_4_ * auVar103._8_4_;
  auVar126._12_4_ = auVar95._12_4_ * auVar103._12_4_;
  auVar126._16_4_ = auVar103._16_4_ * 0.0;
  auVar126._20_4_ = auVar103._20_4_ * 0.0;
  auVar126._24_4_ = auVar103._24_4_ * 0.0;
  auVar126._28_4_ = 0;
  auVar103 = vpminsd_avx2(auVar112,auVar158);
  auVar102 = vpminsd_avx2(auVar106,auVar155);
  auVar103 = vmaxps_avx(auVar103,auVar102);
  auVar102 = vpminsd_avx2(auVar108,auVar126);
  uVar145 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar114._4_4_ = uVar145;
  auVar114._0_4_ = uVar145;
  auVar114._8_4_ = uVar145;
  auVar114._12_4_ = uVar145;
  auVar114._16_4_ = uVar145;
  auVar114._20_4_ = uVar145;
  auVar114._24_4_ = uVar145;
  auVar114._28_4_ = uVar145;
  auVar102 = vmaxps_avx512vl(auVar102,auVar114);
  auVar103 = vmaxps_avx(auVar103,auVar102);
  auVar102._8_4_ = 0x3f7ffffa;
  auVar102._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar102._12_4_ = 0x3f7ffffa;
  auVar102._16_4_ = 0x3f7ffffa;
  auVar102._20_4_ = 0x3f7ffffa;
  auVar102._24_4_ = 0x3f7ffffa;
  auVar102._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar103,auVar102);
  auVar103 = vpmaxsd_avx2(auVar112,auVar158);
  auVar102 = vpmaxsd_avx2(auVar106,auVar155);
  auVar103 = vminps_avx(auVar103,auVar102);
  auVar102 = vpmaxsd_avx2(auVar108,auVar126);
  uVar145 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar113._4_4_ = uVar145;
  auVar113._0_4_ = uVar145;
  auVar113._8_4_ = uVar145;
  auVar113._12_4_ = uVar145;
  auVar113._16_4_ = uVar145;
  auVar113._20_4_ = uVar145;
  auVar113._24_4_ = uVar145;
  auVar113._28_4_ = uVar145;
  auVar102 = vminps_avx512vl(auVar102,auVar113);
  auVar103 = vminps_avx(auVar103,auVar102);
  auVar104._8_4_ = 0x3f800003;
  auVar104._0_8_ = 0x3f8000033f800003;
  auVar104._12_4_ = 0x3f800003;
  auVar104._16_4_ = 0x3f800003;
  auVar104._20_4_ = 0x3f800003;
  auVar104._24_4_ = 0x3f800003;
  auVar104._28_4_ = 0x3f800003;
  auVar103 = vmulps_avx512vl(auVar103,auVar104);
  auVar102 = vpbroadcastd_avx512vl();
  uVar24 = vpcmpgtd_avx512vl(auVar102,_DAT_0205a920);
  uVar146 = vcmpps_avx512vl(local_80,auVar103,2);
  local_7d9 = (byte)((byte)uVar146 & (byte)uVar24) != 0;
  if (local_7d9) {
    uVar85 = (ulong)(byte)((byte)uVar146 & (byte)uVar24);
    local_690 = pre->ray_space + k;
    local_2c0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_688 = prim;
    do {
      lVar25 = 0;
      for (uVar82 = uVar85; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar90 = *(uint *)(local_688 + 2);
      pGVar13 = (context->scene->geometries).items[uVar90].ptr;
      local_440._0_8_ = CONCAT44(0,*(uint *)(local_688 + lVar25 * 4 + 6));
      uVar82 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                               CONCAT44(0,*(uint *)(local_688 + lVar25 * 4 + 6)) *
                               pGVar13[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar169 = (pGVar13->time_range).lower;
      fVar169 = pGVar13->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar169) /
                ((pGVar13->time_range).upper - fVar169));
      auVar93 = vroundss_avx(ZEXT416((uint)fVar169),ZEXT416((uint)fVar169),9);
      auVar93 = vminss_avx(auVar93,ZEXT416((uint)(pGVar13->fnumTimeSegments + -1.0)));
      auVar93 = vmaxss_avx(ZEXT816(0) << 0x20,auVar93);
      fVar169 = fVar169 - auVar93._0_4_;
      _Var14 = pGVar13[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar87 = (long)(int)auVar93._0_4_ * 0x38;
      lVar25 = *(long *)(_Var14 + 0x10 + lVar87);
      lVar91 = *(long *)(_Var14 + 0x38 + lVar87);
      lVar15 = *(long *)(_Var14 + 0x48 + lVar87);
      auVar97._4_4_ = fVar169;
      auVar97._0_4_ = fVar169;
      auVar97._8_4_ = fVar169;
      auVar97._12_4_ = fVar169;
      pfVar3 = (float *)(lVar91 + uVar82 * lVar15);
      auVar190._0_4_ = fVar169 * *pfVar3;
      auVar190._4_4_ = fVar169 * pfVar3[1];
      auVar190._8_4_ = fVar169 * pfVar3[2];
      auVar190._12_4_ = fVar169 * pfVar3[3];
      pfVar3 = (float *)(lVar91 + (uVar82 + 1) * lVar15);
      auVar193._0_4_ = fVar169 * *pfVar3;
      auVar193._4_4_ = fVar169 * pfVar3[1];
      auVar193._8_4_ = fVar169 * pfVar3[2];
      auVar193._12_4_ = fVar169 * pfVar3[3];
      auVar93 = vmulps_avx512vl(auVar97,*(undefined1 (*) [16])(lVar91 + (uVar82 + 2) * lVar15));
      auVar94 = vmulps_avx512vl(auVar97,*(undefined1 (*) [16])(lVar91 + lVar15 * (uVar82 + 3)));
      lVar91 = *(long *)(_Var14 + lVar87);
      fVar169 = 1.0 - fVar169;
      auVar96._4_4_ = fVar169;
      auVar96._0_4_ = fVar169;
      auVar96._8_4_ = fVar169;
      auVar96._12_4_ = fVar169;
      local_750 = vfmadd231ps_fma(auVar190,auVar96,*(undefined1 (*) [16])(lVar91 + lVar25 * uVar82))
      ;
      local_510 = vfmadd231ps_fma(auVar193,auVar96,
                                  *(undefined1 (*) [16])(lVar91 + lVar25 * (uVar82 + 1)));
      local_520 = vfmadd231ps_avx512vl
                            (auVar93,auVar96,*(undefined1 (*) [16])(lVar91 + lVar25 * (uVar82 + 2)))
      ;
      local_530 = vfmadd231ps_avx512vl
                            (auVar94,auVar96,*(undefined1 (*) [16])(lVar91 + lVar25 * (uVar82 + 3)))
      ;
      iVar12 = (int)pGVar13[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar93 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      lVar25 = (long)iVar12 * 0x44;
      auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar95 = vsubps_avx(local_750,auVar93);
      uVar145 = auVar95._0_4_;
      auVar98._4_4_ = uVar145;
      auVar98._0_4_ = uVar145;
      auVar98._8_4_ = uVar145;
      auVar98._12_4_ = uVar145;
      auVar94 = vshufps_avx(auVar95,auVar95,0x55);
      aVar4 = (local_690->vx).field_0;
      aVar5 = (local_690->vy).field_0;
      fVar169 = (local_690->vz).field_0.m128[0];
      fVar144 = *(float *)((long)&(local_690->vz).field_0 + 4);
      fVar168 = *(float *)((long)&(local_690->vz).field_0 + 8);
      fVar176 = *(float *)((long)&(local_690->vz).field_0 + 0xc);
      auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
      auVar195._0_4_ = fVar169 * auVar95._0_4_;
      auVar195._4_4_ = fVar144 * auVar95._4_4_;
      auVar195._8_4_ = fVar168 * auVar95._8_4_;
      auVar195._12_4_ = fVar176 * auVar95._12_4_;
      auVar94 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar5,auVar94);
      auVar6 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar4,auVar98);
      auVar95 = vsubps_avx(local_510,auVar93);
      uVar145 = auVar95._0_4_;
      auVar156._4_4_ = uVar145;
      auVar156._0_4_ = uVar145;
      auVar156._8_4_ = uVar145;
      auVar156._12_4_ = uVar145;
      auVar94 = vshufps_avx(auVar95,auVar95,0x55);
      auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
      auVar196._0_4_ = fVar169 * auVar95._0_4_;
      auVar196._4_4_ = fVar144 * auVar95._4_4_;
      auVar196._8_4_ = fVar168 * auVar95._8_4_;
      auVar196._12_4_ = fVar176 * auVar95._12_4_;
      auVar94 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar5,auVar94);
      auVar210 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar4,auVar156);
      auVar95 = vsubps_avx512vl(local_520,auVar93);
      uVar145 = auVar95._0_4_;
      auVar157._4_4_ = uVar145;
      auVar157._0_4_ = uVar145;
      auVar157._8_4_ = uVar145;
      auVar157._12_4_ = uVar145;
      auVar94 = vshufps_avx(auVar95,auVar95,0x55);
      auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
      auVar197._0_4_ = fVar169 * auVar95._0_4_;
      auVar197._4_4_ = fVar144 * auVar95._4_4_;
      auVar197._8_4_ = fVar168 * auVar95._8_4_;
      auVar197._12_4_ = fVar176 * auVar95._12_4_;
      auVar94 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar5,auVar94);
      auVar95 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar4,auVar157);
      auVar94 = vsubps_avx512vl(local_530,auVar93);
      uVar145 = auVar94._0_4_;
      auVar152._4_4_ = uVar145;
      auVar152._0_4_ = uVar145;
      auVar152._8_4_ = uVar145;
      auVar152._12_4_ = uVar145;
      auVar93 = vshufps_avx(auVar94,auVar94,0x55);
      auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
      auVar201._0_4_ = fVar169 * auVar94._0_4_;
      auVar201._4_4_ = fVar144 * auVar94._4_4_;
      auVar201._8_4_ = fVar168 * auVar94._8_4_;
      auVar201._12_4_ = fVar176 * auVar94._12_4_;
      auVar93 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar5,auVar93);
      auVar7 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar4,auVar152);
      auVar103 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25);
      uVar145 = auVar6._0_4_;
      local_560._4_4_ = uVar145;
      local_560._0_4_ = uVar145;
      local_560._8_4_ = uVar145;
      local_560._12_4_ = uVar145;
      local_560._16_4_ = uVar145;
      local_560._20_4_ = uVar145;
      local_560._24_4_ = uVar145;
      local_560._28_4_ = uVar145;
      auVar102 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x484);
      auVar149._8_4_ = 1;
      auVar149._0_8_ = 0x100000001;
      auVar149._12_4_ = 1;
      auVar149._16_4_ = 1;
      auVar149._20_4_ = 1;
      auVar149._24_4_ = 1;
      auVar149._28_4_ = 1;
      local_500 = vpermps_avx2(auVar149,ZEXT1632(auVar6));
      local_580 = vbroadcastss_avx512vl(auVar210);
      local_5a0 = vpermps_avx512vl(auVar149,ZEXT1632(auVar210));
      auVar114 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x908);
      local_700 = vbroadcastss_avx512vl(auVar95);
      local_5e0 = vpermps_avx512vl(auVar149,ZEXT1632(auVar95));
      auVar113 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0xd8c);
      local_600 = vbroadcastss_avx512vl(auVar7);
      auVar213 = ZEXT3264(local_600);
      local_620 = vpermps_avx512vl(auVar149,ZEXT1632(auVar7));
      auVar214 = ZEXT3264(local_620);
      auVar104 = vmulps_avx512vl(local_600,auVar113);
      auVar105 = vmulps_avx512vl(local_620,auVar113);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar114,local_700);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar114,local_5e0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,local_580);
      auVar106 = vfmadd231ps_avx512vl(auVar105,auVar102,local_5a0);
      auVar107 = vfmadd231ps_avx512vl(auVar104,auVar103,local_560);
      auVar104 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25);
      auVar105 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x484);
      auVar112 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x908);
      auVar101 = vfmadd231ps_avx512vl(auVar106,auVar103,local_500);
      auVar106 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0xd8c);
      auVar108 = vmulps_avx512vl(local_600,auVar106);
      auVar109 = vmulps_avx512vl(local_620,auVar106);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar112,local_700);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar112,local_5e0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,local_580);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,local_5a0);
      auVar8 = vfmadd231ps_fma(auVar108,auVar104,local_560);
      auVar9 = vfmadd231ps_fma(auVar109,auVar104,local_500);
      auVar109 = vsubps_avx512vl(ZEXT1632(auVar8),auVar107);
      auVar110 = vsubps_avx512vl(ZEXT1632(auVar9),auVar101);
      auVar108 = vmulps_avx512vl(auVar101,auVar109);
      auVar99 = vmulps_avx512vl(auVar107,auVar110);
      auVar108 = vsubps_avx512vl(auVar108,auVar99);
      auVar93 = vshufps_avx(local_750,local_750,0xff);
      uVar146 = auVar93._0_8_;
      local_a0._8_8_ = uVar146;
      local_a0._0_8_ = uVar146;
      local_a0._16_8_ = uVar146;
      local_a0._24_8_ = uVar146;
      auVar93 = vshufps_avx(local_510,local_510,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar93);
      auVar93 = vshufps_avx512vl(local_520,local_520,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar93);
      auVar93 = vshufps_avx512vl(local_530,local_530,0xff);
      uVar146 = auVar93._0_8_;
      register0x00001248 = uVar146;
      local_100 = uVar146;
      register0x00001250 = uVar146;
      register0x00001258 = uVar146;
      auVar99 = vmulps_avx512vl(_local_100,auVar113);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar114,local_e0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar102,local_c0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar103,local_a0);
      auVar100 = vmulps_avx512vl(_local_100,auVar106);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar112,local_e0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar105,local_c0);
      auVar10 = vfmadd231ps_fma(auVar100,auVar104,local_a0);
      auVar100 = vmulps_avx512vl(auVar110,auVar110);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar109,auVar109);
      auVar111 = vmaxps_avx512vl(auVar99,ZEXT1632(auVar10));
      auVar111 = vmulps_avx512vl(auVar111,auVar111);
      auVar100 = vmulps_avx512vl(auVar111,auVar100);
      auVar108 = vmulps_avx512vl(auVar108,auVar108);
      uVar146 = vcmpps_avx512vl(auVar108,auVar100,2);
      auVar93 = vblendps_avx(auVar6,local_750,8);
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar94 = vandps_avx512vl(auVar93,auVar96);
      auVar93 = vblendps_avx(auVar210,local_510,8);
      auVar93 = vandps_avx512vl(auVar93,auVar96);
      auVar94 = vmaxps_avx(auVar94,auVar93);
      auVar93 = vblendps_avx(auVar95,local_520,8);
      auVar97 = vandps_avx512vl(auVar93,auVar96);
      auVar93 = vblendps_avx(auVar7,local_530,8);
      auVar93 = vandps_avx512vl(auVar93,auVar96);
      auVar93 = vmaxps_avx(auVar97,auVar93);
      auVar93 = vmaxps_avx(auVar94,auVar93);
      auVar94 = vmovshdup_avx(auVar93);
      auVar94 = vmaxss_avx(auVar94,auVar93);
      auVar93 = vshufpd_avx(auVar93,auVar93,1);
      auVar93 = vmaxss_avx(auVar93,auVar94);
      auVar94 = vcvtsi2ss_avx512f(local_520,iVar12);
      local_460._0_16_ = auVar94;
      auVar192._0_4_ = auVar94._0_4_;
      auVar192._4_4_ = auVar192._0_4_;
      auVar192._8_4_ = auVar192._0_4_;
      auVar192._12_4_ = auVar192._0_4_;
      auVar192._16_4_ = auVar192._0_4_;
      auVar192._20_4_ = auVar192._0_4_;
      auVar192._24_4_ = auVar192._0_4_;
      auVar192._28_4_ = auVar192._0_4_;
      uVar24 = vcmpps_avx512vl(auVar192,_DAT_02020f40,0xe);
      local_370 = (byte)uVar146 & (byte)uVar24;
      fVar144 = auVar93._0_4_ * 4.7683716e-07;
      auVar165._8_4_ = 2;
      auVar165._0_8_ = 0x200000002;
      auVar165._12_4_ = 2;
      auVar165._16_4_ = 2;
      auVar165._20_4_ = 2;
      auVar165._24_4_ = 2;
      auVar165._28_4_ = 2;
      local_120 = vpermps_avx512vl(auVar165,ZEXT1632(auVar6));
      local_140 = vpermps_avx512vl(auVar165,ZEXT1632(auVar210));
      local_160 = vpermps_avx512vl(auVar165,ZEXT1632(auVar95));
      auVar108 = vpermps_avx2(auVar165,ZEXT1632(auVar7));
      fVar169 = *(float *)(ray + k * 4 + 0x60);
      auVar93 = auVar110._0_16_;
      _local_770 = ZEXT416((uint)fVar144);
      if (local_370 == 0) {
        bVar89 = false;
        auVar93 = vxorps_avx512vl(auVar93,auVar93);
        auVar211 = ZEXT1664(auVar93);
        auVar207 = ZEXT3264(local_560);
        auVar208 = ZEXT3264(local_500);
        auVar209 = ZEXT3264(local_580);
        auVar206 = ZEXT3264(local_5a0);
        auVar215 = ZEXT3264(local_700);
        auVar212 = ZEXT3264(local_5e0);
      }
      else {
        fStack_63c = 0.0;
        fStack_638 = 0.0;
        fStack_634 = 0.0;
        auVar106 = vmulps_avx512vl(auVar108,auVar106);
        auVar112 = vfmadd213ps_avx512vl(auVar112,local_160,auVar106);
        auVar105 = vfmadd213ps_avx512vl(auVar105,local_140,auVar112);
        auVar105 = vfmadd213ps_avx512vl(auVar104,local_120,auVar105);
        auVar113 = vmulps_avx512vl(auVar108,auVar113);
        auVar114 = vfmadd213ps_avx512vl(auVar114,local_160,auVar113);
        auVar112 = vfmadd213ps_avx512vl(auVar102,local_140,auVar114);
        auVar102 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1210);
        auVar114 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1694);
        auVar113 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1b18);
        auVar104 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1f9c);
        auVar112 = vfmadd213ps_avx512vl(auVar103,local_120,auVar112);
        auVar103 = vmulps_avx512vl(local_600,auVar104);
        auVar106 = vmulps_avx512vl(local_620,auVar104);
        auVar198._0_4_ = auVar108._0_4_ * auVar104._0_4_;
        auVar198._4_4_ = auVar108._4_4_ * auVar104._4_4_;
        auVar198._8_4_ = auVar108._8_4_ * auVar104._8_4_;
        auVar198._12_4_ = auVar108._12_4_ * auVar104._12_4_;
        auVar198._16_4_ = auVar108._16_4_ * auVar104._16_4_;
        auVar198._20_4_ = auVar108._20_4_ * auVar104._20_4_;
        auVar198._24_4_ = auVar108._24_4_ * auVar104._24_4_;
        auVar198._28_4_ = 0;
        auVar215 = ZEXT3264(local_700);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar113,local_700);
        auVar104 = vfmadd231ps_avx512vl(auVar106,auVar113,local_5e0);
        auVar113 = vfmadd231ps_avx512vl(auVar198,local_160,auVar113);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar114,local_580);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar114,local_5a0);
        auVar106 = vfmadd231ps_avx512vl(auVar113,local_140,auVar114);
        auVar100 = vfmadd231ps_avx512vl(auVar103,auVar102,local_560);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,local_500);
        auVar103 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1210);
        auVar114 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1b18);
        auVar113 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1f9c);
        auVar106 = vfmadd231ps_avx512vl(auVar106,local_120,auVar102);
        auVar102 = vmulps_avx512vl(local_600,auVar113);
        auVar111 = vmulps_avx512vl(local_620,auVar113);
        auVar35._4_4_ = auVar108._4_4_ * auVar113._4_4_;
        auVar35._0_4_ = auVar108._0_4_ * auVar113._0_4_;
        auVar35._8_4_ = auVar108._8_4_ * auVar113._8_4_;
        auVar35._12_4_ = auVar108._12_4_ * auVar113._12_4_;
        auVar35._16_4_ = auVar108._16_4_ * auVar113._16_4_;
        auVar35._20_4_ = auVar108._20_4_ * auVar113._20_4_;
        auVar35._24_4_ = auVar108._24_4_ * auVar113._24_4_;
        auVar35._28_4_ = auVar113._28_4_;
        auVar113 = vfmadd231ps_avx512vl(auVar102,auVar114,local_700);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar114,local_5e0);
        auVar114 = vfmadd231ps_avx512vl(auVar35,local_160,auVar114);
        auVar102 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1694);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar102,local_580);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar102,local_5a0);
        auVar102 = vfmadd231ps_avx512vl(auVar114,local_140,auVar102);
        auVar114 = vfmadd231ps_avx512vl(auVar113,auVar103,local_560);
        auVar113 = vfmadd231ps_avx512vl(auVar111,auVar103,local_500);
        auVar111 = vfmadd231ps_avx512vl(auVar102,local_120,auVar103);
        auVar203._8_4_ = 0x7fffffff;
        auVar203._0_8_ = 0x7fffffff7fffffff;
        auVar203._12_4_ = 0x7fffffff;
        auVar203._16_4_ = 0x7fffffff;
        auVar203._20_4_ = 0x7fffffff;
        auVar203._24_4_ = 0x7fffffff;
        auVar203._28_4_ = 0x7fffffff;
        auVar103 = vandps_avx(auVar100,auVar203);
        auVar102 = vandps_avx(auVar104,auVar203);
        auVar102 = vmaxps_avx(auVar103,auVar102);
        auVar103 = vandps_avx(auVar106,auVar203);
        auVar103 = vmaxps_avx(auVar102,auVar103);
        auVar106 = vbroadcastss_avx512vl(_local_770);
        uVar82 = vcmpps_avx512vl(auVar103,auVar106,1);
        bVar89 = (bool)((byte)uVar82 & 1);
        auVar115._0_4_ = (float)((uint)bVar89 * auVar109._0_4_ | (uint)!bVar89 * auVar100._0_4_);
        bVar89 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar89 * auVar109._4_4_ | (uint)!bVar89 * auVar100._4_4_);
        bVar89 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar89 * auVar109._8_4_ | (uint)!bVar89 * auVar100._8_4_);
        bVar89 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar89 * auVar109._12_4_ | (uint)!bVar89 * auVar100._12_4_);
        bVar89 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar89 * auVar109._16_4_ | (uint)!bVar89 * auVar100._16_4_);
        bVar89 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar89 * auVar109._20_4_ | (uint)!bVar89 * auVar100._20_4_);
        bVar89 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar89 * auVar109._24_4_ | (uint)!bVar89 * auVar100._24_4_);
        bVar89 = SUB81(uVar82 >> 7,0);
        auVar115._28_4_ = (uint)bVar89 * auVar109._28_4_ | (uint)!bVar89 * auVar100._28_4_;
        bVar89 = (bool)((byte)uVar82 & 1);
        auVar116._0_4_ = (float)((uint)bVar89 * auVar110._0_4_ | (uint)!bVar89 * auVar104._0_4_);
        bVar89 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar89 * auVar110._4_4_ | (uint)!bVar89 * auVar104._4_4_);
        bVar89 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar89 * auVar110._8_4_ | (uint)!bVar89 * auVar104._8_4_);
        bVar89 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar89 * auVar110._12_4_ | (uint)!bVar89 * auVar104._12_4_);
        bVar89 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar89 * auVar110._16_4_ | (uint)!bVar89 * auVar104._16_4_);
        bVar89 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar89 * auVar110._20_4_ | (uint)!bVar89 * auVar104._20_4_);
        bVar89 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar89 * auVar110._24_4_ | (uint)!bVar89 * auVar104._24_4_);
        bVar89 = SUB81(uVar82 >> 7,0);
        auVar116._28_4_ = (uint)bVar89 * auVar110._28_4_ | (uint)!bVar89 * auVar104._28_4_;
        auVar103 = vandps_avx(auVar203,auVar114);
        auVar102 = vandps_avx(auVar113,auVar203);
        auVar102 = vmaxps_avx(auVar103,auVar102);
        auVar103 = vandps_avx(auVar111,auVar203);
        auVar103 = vmaxps_avx(auVar102,auVar103);
        uVar82 = vcmpps_avx512vl(auVar103,auVar106,1);
        bVar89 = (bool)((byte)uVar82 & 1);
        auVar117._0_4_ = (float)((uint)bVar89 * auVar109._0_4_ | (uint)!bVar89 * auVar114._0_4_);
        bVar89 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar89 * auVar109._4_4_ | (uint)!bVar89 * auVar114._4_4_);
        bVar89 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar89 * auVar109._8_4_ | (uint)!bVar89 * auVar114._8_4_);
        bVar89 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar89 * auVar109._12_4_ | (uint)!bVar89 * auVar114._12_4_);
        bVar89 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar89 * auVar109._16_4_ | (uint)!bVar89 * auVar114._16_4_);
        bVar89 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar89 * auVar109._20_4_ | (uint)!bVar89 * auVar114._20_4_);
        bVar89 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar89 * auVar109._24_4_ | (uint)!bVar89 * auVar114._24_4_);
        bVar89 = SUB81(uVar82 >> 7,0);
        auVar117._28_4_ = (uint)bVar89 * auVar109._28_4_ | (uint)!bVar89 * auVar114._28_4_;
        bVar89 = (bool)((byte)uVar82 & 1);
        auVar118._0_4_ = (float)((uint)bVar89 * auVar110._0_4_ | (uint)!bVar89 * auVar113._0_4_);
        bVar89 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar89 * auVar110._4_4_ | (uint)!bVar89 * auVar113._4_4_);
        bVar89 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar89 * auVar110._8_4_ | (uint)!bVar89 * auVar113._8_4_);
        bVar89 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar89 * auVar110._12_4_ | (uint)!bVar89 * auVar113._12_4_);
        bVar89 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar89 * auVar110._16_4_ | (uint)!bVar89 * auVar113._16_4_);
        bVar89 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar89 * auVar110._20_4_ | (uint)!bVar89 * auVar113._20_4_);
        bVar89 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar89 * auVar110._24_4_ | (uint)!bVar89 * auVar113._24_4_);
        bVar89 = SUB81(uVar82 >> 7,0);
        auVar118._28_4_ = (uint)bVar89 * auVar110._28_4_ | (uint)!bVar89 * auVar113._28_4_;
        auVar98 = vxorps_avx512vl(auVar93,auVar93);
        auVar211 = ZEXT1664(auVar98);
        auVar103 = vfmadd213ps_avx512vl(auVar115,auVar115,ZEXT1632(auVar98));
        auVar93 = vfmadd231ps_fma(auVar103,auVar116,auVar116);
        auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar93));
        fVar168 = auVar103._0_4_;
        fVar176 = auVar103._4_4_;
        fVar177 = auVar103._8_4_;
        fVar178 = auVar103._12_4_;
        fVar160 = auVar103._16_4_;
        fVar167 = auVar103._20_4_;
        fVar92 = auVar103._24_4_;
        auVar36._4_4_ = fVar176 * fVar176 * fVar176 * auVar93._4_4_ * -0.5;
        auVar36._0_4_ = fVar168 * fVar168 * fVar168 * auVar93._0_4_ * -0.5;
        auVar36._8_4_ = fVar177 * fVar177 * fVar177 * auVar93._8_4_ * -0.5;
        auVar36._12_4_ = fVar178 * fVar178 * fVar178 * auVar93._12_4_ * -0.5;
        auVar36._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
        auVar36._20_4_ = fVar167 * fVar167 * fVar167 * -0.0;
        auVar36._24_4_ = fVar92 * fVar92 * fVar92 * -0.0;
        auVar36._28_4_ = auVar111._28_4_;
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar103 = vfmadd231ps_avx512vl(auVar36,auVar102,auVar103);
        auVar37._4_4_ = auVar116._4_4_ * auVar103._4_4_;
        auVar37._0_4_ = auVar116._0_4_ * auVar103._0_4_;
        auVar37._8_4_ = auVar116._8_4_ * auVar103._8_4_;
        auVar37._12_4_ = auVar116._12_4_ * auVar103._12_4_;
        auVar37._16_4_ = auVar116._16_4_ * auVar103._16_4_;
        auVar37._20_4_ = auVar116._20_4_ * auVar103._20_4_;
        auVar37._24_4_ = auVar116._24_4_ * auVar103._24_4_;
        auVar37._28_4_ = 0;
        auVar38._4_4_ = auVar103._4_4_ * -auVar115._4_4_;
        auVar38._0_4_ = auVar103._0_4_ * -auVar115._0_4_;
        auVar38._8_4_ = auVar103._8_4_ * -auVar115._8_4_;
        auVar38._12_4_ = auVar103._12_4_ * -auVar115._12_4_;
        auVar38._16_4_ = auVar103._16_4_ * -auVar115._16_4_;
        auVar38._20_4_ = auVar103._20_4_ * -auVar115._20_4_;
        auVar38._24_4_ = auVar103._24_4_ * -auVar115._24_4_;
        auVar38._28_4_ = auVar116._28_4_;
        auVar103 = vmulps_avx512vl(auVar103,ZEXT1632(auVar98));
        auVar109 = ZEXT1632(auVar98);
        auVar114 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar109);
        auVar93 = vfmadd231ps_fma(auVar114,auVar118,auVar118);
        auVar114 = vrsqrt14ps_avx512vl(ZEXT1632(auVar93));
        fVar168 = auVar114._0_4_;
        fVar176 = auVar114._4_4_;
        fVar177 = auVar114._8_4_;
        fVar178 = auVar114._12_4_;
        fVar160 = auVar114._16_4_;
        fVar167 = auVar114._20_4_;
        fVar92 = auVar114._24_4_;
        auVar39._4_4_ = fVar176 * fVar176 * fVar176 * auVar93._4_4_ * -0.5;
        auVar39._0_4_ = fVar168 * fVar168 * fVar168 * auVar93._0_4_ * -0.5;
        auVar39._8_4_ = fVar177 * fVar177 * fVar177 * auVar93._8_4_ * -0.5;
        auVar39._12_4_ = fVar178 * fVar178 * fVar178 * auVar93._12_4_ * -0.5;
        auVar39._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
        auVar39._20_4_ = fVar167 * fVar167 * fVar167 * -0.0;
        auVar39._24_4_ = fVar92 * fVar92 * fVar92 * -0.0;
        auVar39._28_4_ = 0;
        auVar102 = vfmadd231ps_avx512vl(auVar39,auVar102,auVar114);
        auVar40._4_4_ = auVar118._4_4_ * auVar102._4_4_;
        auVar40._0_4_ = auVar118._0_4_ * auVar102._0_4_;
        auVar40._8_4_ = auVar118._8_4_ * auVar102._8_4_;
        auVar40._12_4_ = auVar118._12_4_ * auVar102._12_4_;
        auVar40._16_4_ = auVar118._16_4_ * auVar102._16_4_;
        auVar40._20_4_ = auVar118._20_4_ * auVar102._20_4_;
        auVar40._24_4_ = auVar118._24_4_ * auVar102._24_4_;
        auVar40._28_4_ = auVar114._28_4_;
        auVar41._4_4_ = -auVar117._4_4_ * auVar102._4_4_;
        auVar41._0_4_ = -auVar117._0_4_ * auVar102._0_4_;
        auVar41._8_4_ = -auVar117._8_4_ * auVar102._8_4_;
        auVar41._12_4_ = -auVar117._12_4_ * auVar102._12_4_;
        auVar41._16_4_ = -auVar117._16_4_ * auVar102._16_4_;
        auVar41._20_4_ = -auVar117._20_4_ * auVar102._20_4_;
        auVar41._24_4_ = -auVar117._24_4_ * auVar102._24_4_;
        auVar41._28_4_ = auVar117._28_4_ ^ 0x80000000;
        auVar102 = vmulps_avx512vl(auVar102,auVar109);
        auVar93 = vfmadd213ps_fma(auVar37,auVar99,auVar107);
        auVar94 = vfmadd213ps_fma(auVar38,auVar99,auVar101);
        auVar114 = vfmadd213ps_avx512vl(auVar103,auVar99,auVar112);
        auVar113 = vfmadd213ps_avx512vl(auVar40,ZEXT1632(auVar10),ZEXT1632(auVar8));
        auVar96 = vfnmadd213ps_fma(auVar37,auVar99,auVar107);
        auVar106 = ZEXT1632(auVar10);
        auVar95 = vfmadd213ps_fma(auVar41,auVar106,ZEXT1632(auVar9));
        auVar97 = vfnmadd213ps_fma(auVar38,auVar99,auVar101);
        auVar6 = vfmadd213ps_fma(auVar102,auVar106,auVar105);
        auVar104 = vfnmadd231ps_avx512vl(auVar112,auVar99,auVar103);
        auVar8 = vfnmadd213ps_fma(auVar40,auVar106,ZEXT1632(auVar8));
        auVar9 = vfnmadd213ps_fma(auVar41,auVar106,ZEXT1632(auVar9));
        auVar152 = vfnmadd231ps_fma(auVar105,ZEXT1632(auVar10),auVar102);
        auVar102 = vsubps_avx512vl(auVar113,ZEXT1632(auVar96));
        auVar103 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar97));
        auVar105 = vsubps_avx512vl(ZEXT1632(auVar6),auVar104);
        auVar112 = vmulps_avx512vl(auVar103,auVar104);
        auVar210 = vfmsub231ps_fma(auVar112,ZEXT1632(auVar97),auVar105);
        auVar42._4_4_ = auVar96._4_4_ * auVar105._4_4_;
        auVar42._0_4_ = auVar96._0_4_ * auVar105._0_4_;
        auVar42._8_4_ = auVar96._8_4_ * auVar105._8_4_;
        auVar42._12_4_ = auVar96._12_4_ * auVar105._12_4_;
        auVar42._16_4_ = auVar105._16_4_ * 0.0;
        auVar42._20_4_ = auVar105._20_4_ * 0.0;
        auVar42._24_4_ = auVar105._24_4_ * 0.0;
        auVar42._28_4_ = auVar105._28_4_;
        auVar105 = vfmsub231ps_avx512vl(auVar42,auVar104,auVar102);
        auVar43._4_4_ = auVar97._4_4_ * auVar102._4_4_;
        auVar43._0_4_ = auVar97._0_4_ * auVar102._0_4_;
        auVar43._8_4_ = auVar97._8_4_ * auVar102._8_4_;
        auVar43._12_4_ = auVar97._12_4_ * auVar102._12_4_;
        auVar43._16_4_ = auVar102._16_4_ * 0.0;
        auVar43._20_4_ = auVar102._20_4_ * 0.0;
        auVar43._24_4_ = auVar102._24_4_ * 0.0;
        auVar43._28_4_ = auVar102._28_4_;
        auVar7 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar96),auVar103);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar109,auVar105);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar109,ZEXT1632(auVar210));
        auVar110 = ZEXT1632(auVar98);
        uVar82 = vcmpps_avx512vl(auVar103,auVar110,2);
        bVar84 = (byte)uVar82;
        fVar92 = (float)((uint)(bVar84 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar84 & 1) * auVar8._0_4_);
        bVar89 = (bool)((byte)(uVar82 >> 1) & 1);
        fVar137 = (float)((uint)bVar89 * auVar93._4_4_ | (uint)!bVar89 * auVar8._4_4_);
        bVar89 = (bool)((byte)(uVar82 >> 2) & 1);
        fVar139 = (float)((uint)bVar89 * auVar93._8_4_ | (uint)!bVar89 * auVar8._8_4_);
        bVar89 = (bool)((byte)(uVar82 >> 3) & 1);
        fVar141 = (float)((uint)bVar89 * auVar93._12_4_ | (uint)!bVar89 * auVar8._12_4_);
        auVar112 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar139,CONCAT44(fVar137,fVar92))));
        fVar159 = (float)((uint)(bVar84 & 1) * auVar94._0_4_ |
                         (uint)!(bool)(bVar84 & 1) * auVar9._0_4_);
        bVar89 = (bool)((byte)(uVar82 >> 1) & 1);
        fVar138 = (float)((uint)bVar89 * auVar94._4_4_ | (uint)!bVar89 * auVar9._4_4_);
        bVar89 = (bool)((byte)(uVar82 >> 2) & 1);
        fVar140 = (float)((uint)bVar89 * auVar94._8_4_ | (uint)!bVar89 * auVar9._8_4_);
        bVar89 = (bool)((byte)(uVar82 >> 3) & 1);
        fVar142 = (float)((uint)bVar89 * auVar94._12_4_ | (uint)!bVar89 * auVar9._12_4_);
        auVar106 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar140,CONCAT44(fVar138,fVar159))));
        auVar119._0_4_ =
             (float)((uint)(bVar84 & 1) * auVar114._0_4_ |
                    (uint)!(bool)(bVar84 & 1) * auVar152._0_4_);
        bVar89 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar89 * auVar114._4_4_ | (uint)!bVar89 * auVar152._4_4_);
        bVar89 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar89 * auVar114._8_4_ | (uint)!bVar89 * auVar152._8_4_);
        bVar89 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar89 * auVar114._12_4_ | (uint)!bVar89 * auVar152._12_4_);
        fVar168 = (float)((uint)((byte)(uVar82 >> 4) & 1) * auVar114._16_4_);
        auVar119._16_4_ = fVar168;
        fVar176 = (float)((uint)((byte)(uVar82 >> 5) & 1) * auVar114._20_4_);
        auVar119._20_4_ = fVar176;
        fVar177 = (float)((uint)((byte)(uVar82 >> 6) & 1) * auVar114._24_4_);
        auVar119._24_4_ = fVar177;
        iVar1 = (uint)(byte)(uVar82 >> 7) * auVar114._28_4_;
        auVar119._28_4_ = iVar1;
        auVar102 = vblendmps_avx512vl(ZEXT1632(auVar96),auVar113);
        auVar120._0_4_ =
             (uint)(bVar84 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar210._0_4_;
        bVar89 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar89 * auVar102._4_4_ | (uint)!bVar89 * auVar210._4_4_;
        bVar89 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar89 * auVar102._8_4_ | (uint)!bVar89 * auVar210._8_4_;
        bVar89 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar89 * auVar102._12_4_ | (uint)!bVar89 * auVar210._12_4_;
        auVar120._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * auVar102._16_4_;
        auVar120._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * auVar102._20_4_;
        auVar120._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * auVar102._24_4_;
        auVar120._28_4_ = (uint)(byte)(uVar82 >> 7) * auVar102._28_4_;
        auVar102 = vblendmps_avx512vl(ZEXT1632(auVar97),ZEXT1632(auVar95));
        auVar121._0_4_ =
             (float)((uint)(bVar84 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar94._0_4_
                    );
        bVar89 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar89 * auVar102._4_4_ | (uint)!bVar89 * auVar94._4_4_);
        bVar89 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar89 * auVar102._8_4_ | (uint)!bVar89 * auVar94._8_4_);
        bVar89 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar89 * auVar102._12_4_ | (uint)!bVar89 * auVar94._12_4_);
        fVar160 = (float)((uint)((byte)(uVar82 >> 4) & 1) * auVar102._16_4_);
        auVar121._16_4_ = fVar160;
        fVar167 = (float)((uint)((byte)(uVar82 >> 5) & 1) * auVar102._20_4_);
        auVar121._20_4_ = fVar167;
        fVar178 = (float)((uint)((byte)(uVar82 >> 6) & 1) * auVar102._24_4_);
        auVar121._24_4_ = fVar178;
        auVar121._28_4_ = (uint)(byte)(uVar82 >> 7) * auVar102._28_4_;
        auVar102 = vblendmps_avx512vl(auVar104,ZEXT1632(auVar6));
        auVar122._0_4_ =
             (float)((uint)(bVar84 & 1) * auVar102._0_4_ |
                    (uint)!(bool)(bVar84 & 1) * auVar114._0_4_);
        bVar89 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar89 * auVar102._4_4_ | (uint)!bVar89 * auVar114._4_4_);
        bVar89 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar89 * auVar102._8_4_ | (uint)!bVar89 * auVar114._8_4_);
        bVar89 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar89 * auVar102._12_4_ | (uint)!bVar89 * auVar114._12_4_);
        bVar89 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar122._16_4_ = (float)((uint)bVar89 * auVar102._16_4_ | (uint)!bVar89 * auVar114._16_4_);
        bVar89 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar122._20_4_ = (float)((uint)bVar89 * auVar102._20_4_ | (uint)!bVar89 * auVar114._20_4_);
        bVar89 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar122._24_4_ = (float)((uint)bVar89 * auVar102._24_4_ | (uint)!bVar89 * auVar114._24_4_);
        bVar89 = SUB81(uVar82 >> 7,0);
        auVar122._28_4_ = (uint)bVar89 * auVar102._28_4_ | (uint)!bVar89 * auVar114._28_4_;
        auVar123._0_4_ =
             (uint)(bVar84 & 1) * (int)auVar96._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar113._0_4_;
        bVar89 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar123._4_4_ = (uint)bVar89 * (int)auVar96._4_4_ | (uint)!bVar89 * auVar113._4_4_;
        bVar89 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar123._8_4_ = (uint)bVar89 * (int)auVar96._8_4_ | (uint)!bVar89 * auVar113._8_4_;
        bVar89 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar123._12_4_ = (uint)bVar89 * (int)auVar96._12_4_ | (uint)!bVar89 * auVar113._12_4_;
        auVar123._16_4_ = (uint)!(bool)((byte)(uVar82 >> 4) & 1) * auVar113._16_4_;
        auVar123._20_4_ = (uint)!(bool)((byte)(uVar82 >> 5) & 1) * auVar113._20_4_;
        auVar123._24_4_ = (uint)!(bool)((byte)(uVar82 >> 6) & 1) * auVar113._24_4_;
        auVar123._28_4_ = (uint)!SUB81(uVar82 >> 7,0) * auVar113._28_4_;
        bVar89 = (bool)((byte)(uVar82 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar82 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar124._0_4_ =
             (uint)(bVar84 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar6._0_4_;
        bVar17 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar17 * auVar104._4_4_ | (uint)!bVar17 * auVar6._4_4_;
        bVar17 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar17 * auVar104._8_4_ | (uint)!bVar17 * auVar6._8_4_;
        bVar17 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar17 * auVar104._12_4_ | (uint)!bVar17 * auVar6._12_4_;
        auVar124._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * auVar104._16_4_;
        auVar124._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * auVar104._20_4_;
        auVar124._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * auVar104._24_4_;
        iVar2 = (uint)(byte)(uVar82 >> 7) * auVar104._28_4_;
        auVar124._28_4_ = iVar2;
        auVar107 = vsubps_avx512vl(auVar123,auVar112);
        auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar97._12_4_ |
                                                 (uint)!bVar19 * auVar95._12_4_,
                                                 CONCAT48((uint)bVar18 * (int)auVar97._8_4_ |
                                                          (uint)!bVar18 * auVar95._8_4_,
                                                          CONCAT44((uint)bVar89 * (int)auVar97._4_4_
                                                                   | (uint)!bVar89 * auVar95._4_4_,
                                                                   (uint)(bVar84 & 1) *
                                                                   (int)auVar97._0_4_ |
                                                                   (uint)!(bool)(bVar84 & 1) *
                                                                   auVar95._0_4_)))),auVar106);
        auVar114 = vsubps_avx(auVar124,auVar119);
        auVar113 = vsubps_avx(auVar112,auVar120);
        auVar104 = vsubps_avx(auVar106,auVar121);
        auVar105 = vsubps_avx(auVar119,auVar122);
        auVar44._4_4_ = auVar114._4_4_ * fVar137;
        auVar44._0_4_ = auVar114._0_4_ * fVar92;
        auVar44._8_4_ = auVar114._8_4_ * fVar139;
        auVar44._12_4_ = auVar114._12_4_ * fVar141;
        auVar44._16_4_ = auVar114._16_4_ * 0.0;
        auVar44._20_4_ = auVar114._20_4_ * 0.0;
        auVar44._24_4_ = auVar114._24_4_ * 0.0;
        auVar44._28_4_ = iVar2;
        auVar93 = vfmsub231ps_fma(auVar44,auVar119,auVar107);
        auVar45._4_4_ = fVar138 * auVar107._4_4_;
        auVar45._0_4_ = fVar159 * auVar107._0_4_;
        auVar45._8_4_ = fVar140 * auVar107._8_4_;
        auVar45._12_4_ = fVar142 * auVar107._12_4_;
        auVar45._16_4_ = auVar107._16_4_ * 0.0;
        auVar45._20_4_ = auVar107._20_4_ * 0.0;
        auVar45._24_4_ = auVar107._24_4_ * 0.0;
        auVar45._28_4_ = auVar103._28_4_;
        auVar94 = vfmsub231ps_fma(auVar45,auVar112,auVar102);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar110,ZEXT1632(auVar93));
        auVar170._0_4_ = auVar102._0_4_ * auVar119._0_4_;
        auVar170._4_4_ = auVar102._4_4_ * auVar119._4_4_;
        auVar170._8_4_ = auVar102._8_4_ * auVar119._8_4_;
        auVar170._12_4_ = auVar102._12_4_ * auVar119._12_4_;
        auVar170._16_4_ = auVar102._16_4_ * fVar168;
        auVar170._20_4_ = auVar102._20_4_ * fVar176;
        auVar170._24_4_ = auVar102._24_4_ * fVar177;
        auVar170._28_4_ = 0;
        auVar93 = vfmsub231ps_fma(auVar170,auVar106,auVar114);
        auVar101 = vfmadd231ps_avx512vl(auVar103,auVar110,ZEXT1632(auVar93));
        auVar103 = vmulps_avx512vl(auVar105,auVar120);
        auVar103 = vfmsub231ps_avx512vl(auVar103,auVar113,auVar122);
        auVar46._4_4_ = auVar104._4_4_ * auVar122._4_4_;
        auVar46._0_4_ = auVar104._0_4_ * auVar122._0_4_;
        auVar46._8_4_ = auVar104._8_4_ * auVar122._8_4_;
        auVar46._12_4_ = auVar104._12_4_ * auVar122._12_4_;
        auVar46._16_4_ = auVar104._16_4_ * auVar122._16_4_;
        auVar46._20_4_ = auVar104._20_4_ * auVar122._20_4_;
        auVar46._24_4_ = auVar104._24_4_ * auVar122._24_4_;
        auVar46._28_4_ = auVar122._28_4_;
        auVar93 = vfmsub231ps_fma(auVar46,auVar121,auVar105);
        auVar171._0_4_ = auVar121._0_4_ * auVar113._0_4_;
        auVar171._4_4_ = auVar121._4_4_ * auVar113._4_4_;
        auVar171._8_4_ = auVar121._8_4_ * auVar113._8_4_;
        auVar171._12_4_ = auVar121._12_4_ * auVar113._12_4_;
        auVar171._16_4_ = fVar160 * auVar113._16_4_;
        auVar171._20_4_ = fVar167 * auVar113._20_4_;
        auVar171._24_4_ = fVar178 * auVar113._24_4_;
        auVar171._28_4_ = 0;
        auVar94 = vfmsub231ps_fma(auVar171,auVar104,auVar120);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar110,auVar103);
        auVar109 = vfmadd231ps_avx512vl(auVar103,auVar110,ZEXT1632(auVar93));
        auVar103 = vmaxps_avx(auVar101,auVar109);
        uVar146 = vcmpps_avx512vl(auVar103,auVar110,2);
        local_370 = local_370 & (byte)uVar146;
        auVar207 = ZEXT3264(local_560);
        auVar208 = ZEXT3264(local_500);
        auVar209 = ZEXT3264(local_580);
        auVar206 = ZEXT3264(local_5a0);
        auVar200 = ZEXT1664(_local_770);
        if (local_370 == 0) {
          local_370 = 0;
        }
        else {
          auVar47._4_4_ = auVar105._4_4_ * auVar102._4_4_;
          auVar47._0_4_ = auVar105._0_4_ * auVar102._0_4_;
          auVar47._8_4_ = auVar105._8_4_ * auVar102._8_4_;
          auVar47._12_4_ = auVar105._12_4_ * auVar102._12_4_;
          auVar47._16_4_ = auVar105._16_4_ * auVar102._16_4_;
          auVar47._20_4_ = auVar105._20_4_ * auVar102._20_4_;
          auVar47._24_4_ = auVar105._24_4_ * auVar102._24_4_;
          auVar47._28_4_ = auVar103._28_4_;
          auVar95 = vfmsub231ps_fma(auVar47,auVar104,auVar114);
          auVar48._4_4_ = auVar114._4_4_ * auVar113._4_4_;
          auVar48._0_4_ = auVar114._0_4_ * auVar113._0_4_;
          auVar48._8_4_ = auVar114._8_4_ * auVar113._8_4_;
          auVar48._12_4_ = auVar114._12_4_ * auVar113._12_4_;
          auVar48._16_4_ = auVar114._16_4_ * auVar113._16_4_;
          auVar48._20_4_ = auVar114._20_4_ * auVar113._20_4_;
          auVar48._24_4_ = auVar114._24_4_ * auVar113._24_4_;
          auVar48._28_4_ = auVar114._28_4_;
          auVar94 = vfmsub231ps_fma(auVar48,auVar107,auVar105);
          auVar49._4_4_ = auVar104._4_4_ * auVar107._4_4_;
          auVar49._0_4_ = auVar104._0_4_ * auVar107._0_4_;
          auVar49._8_4_ = auVar104._8_4_ * auVar107._8_4_;
          auVar49._12_4_ = auVar104._12_4_ * auVar107._12_4_;
          auVar49._16_4_ = auVar104._16_4_ * auVar107._16_4_;
          auVar49._20_4_ = auVar104._20_4_ * auVar107._20_4_;
          auVar49._24_4_ = auVar104._24_4_ * auVar107._24_4_;
          auVar49._28_4_ = auVar104._28_4_;
          auVar6 = vfmsub231ps_fma(auVar49,auVar113,auVar102);
          auVar93 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar94),ZEXT1632(auVar6));
          auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar95),auVar110);
          auVar102 = vrcp14ps_avx512vl(auVar103);
          auVar26._8_4_ = 0x3f800000;
          auVar26._0_8_ = &DAT_3f8000003f800000;
          auVar26._12_4_ = 0x3f800000;
          auVar26._16_4_ = 0x3f800000;
          auVar26._20_4_ = 0x3f800000;
          auVar26._24_4_ = 0x3f800000;
          auVar26._28_4_ = 0x3f800000;
          auVar114 = vfnmadd213ps_avx512vl(auVar102,auVar103,auVar26);
          auVar93 = vfmadd132ps_fma(auVar114,auVar102,auVar102);
          auVar50._4_4_ = auVar6._4_4_ * auVar119._4_4_;
          auVar50._0_4_ = auVar6._0_4_ * auVar119._0_4_;
          auVar50._8_4_ = auVar6._8_4_ * auVar119._8_4_;
          auVar50._12_4_ = auVar6._12_4_ * auVar119._12_4_;
          auVar50._16_4_ = fVar168 * 0.0;
          auVar50._20_4_ = fVar176 * 0.0;
          auVar50._24_4_ = fVar177 * 0.0;
          auVar50._28_4_ = iVar1;
          auVar94 = vfmadd231ps_fma(auVar50,auVar106,ZEXT1632(auVar94));
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar112,ZEXT1632(auVar95));
          fVar168 = auVar93._0_4_;
          fVar176 = auVar93._4_4_;
          fVar177 = auVar93._8_4_;
          fVar178 = auVar93._12_4_;
          auVar102 = ZEXT1632(CONCAT412(auVar94._12_4_ * fVar178,
                                        CONCAT48(auVar94._8_4_ * fVar177,
                                                 CONCAT44(auVar94._4_4_ * fVar176,
                                                          auVar94._0_4_ * fVar168))));
          auVar189._4_4_ = fVar169;
          auVar189._0_4_ = fVar169;
          auVar189._8_4_ = fVar169;
          auVar189._12_4_ = fVar169;
          auVar189._16_4_ = fVar169;
          auVar189._20_4_ = fVar169;
          auVar189._24_4_ = fVar169;
          auVar189._28_4_ = fVar169;
          uVar146 = vcmpps_avx512vl(auVar189,auVar102,2);
          uVar145 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar27._4_4_ = uVar145;
          auVar27._0_4_ = uVar145;
          auVar27._8_4_ = uVar145;
          auVar27._12_4_ = uVar145;
          auVar27._16_4_ = uVar145;
          auVar27._20_4_ = uVar145;
          auVar27._24_4_ = uVar145;
          auVar27._28_4_ = uVar145;
          uVar24 = vcmpps_avx512vl(auVar102,auVar27,2);
          local_370 = (byte)uVar146 & (byte)uVar24 & local_370;
          if (local_370 != 0) {
            uVar146 = vcmpps_avx512vl(auVar103,auVar110,4);
            if ((local_370 & (byte)uVar146) != 0) {
              local_370 = local_370 & (byte)uVar146;
              fVar160 = auVar101._0_4_ * fVar168;
              fVar167 = auVar101._4_4_ * fVar176;
              auVar51._4_4_ = fVar167;
              auVar51._0_4_ = fVar160;
              fVar92 = auVar101._8_4_ * fVar177;
              auVar51._8_4_ = fVar92;
              fVar159 = auVar101._12_4_ * fVar178;
              auVar51._12_4_ = fVar159;
              fVar137 = auVar101._16_4_ * 0.0;
              auVar51._16_4_ = fVar137;
              fVar138 = auVar101._20_4_ * 0.0;
              auVar51._20_4_ = fVar138;
              fVar139 = auVar101._24_4_ * 0.0;
              auVar51._24_4_ = fVar139;
              auVar51._28_4_ = auVar101._28_4_;
              fVar168 = auVar109._0_4_ * fVar168;
              fVar176 = auVar109._4_4_ * fVar176;
              auVar52._4_4_ = fVar176;
              auVar52._0_4_ = fVar168;
              fVar177 = auVar109._8_4_ * fVar177;
              auVar52._8_4_ = fVar177;
              fVar178 = auVar109._12_4_ * fVar178;
              auVar52._12_4_ = fVar178;
              fVar140 = auVar109._16_4_ * 0.0;
              auVar52._16_4_ = fVar140;
              fVar141 = auVar109._20_4_ * 0.0;
              auVar52._20_4_ = fVar141;
              fVar142 = auVar109._24_4_ * 0.0;
              auVar52._24_4_ = fVar142;
              auVar52._28_4_ = auVar109._28_4_;
              auVar185._8_4_ = 0x3f800000;
              auVar185._0_8_ = &DAT_3f8000003f800000;
              auVar185._12_4_ = 0x3f800000;
              auVar185._16_4_ = 0x3f800000;
              auVar185._20_4_ = 0x3f800000;
              auVar185._24_4_ = 0x3f800000;
              auVar185._28_4_ = 0x3f800000;
              auVar103 = vsubps_avx(auVar185,auVar51);
              local_720._0_4_ =
                   (uint)(bVar84 & 1) * (int)fVar160 | (uint)!(bool)(bVar84 & 1) * auVar103._0_4_;
              bVar89 = (bool)((byte)(uVar82 >> 1) & 1);
              local_720._4_4_ = (uint)bVar89 * (int)fVar167 | (uint)!bVar89 * auVar103._4_4_;
              bVar89 = (bool)((byte)(uVar82 >> 2) & 1);
              local_720._8_4_ = (uint)bVar89 * (int)fVar92 | (uint)!bVar89 * auVar103._8_4_;
              bVar89 = (bool)((byte)(uVar82 >> 3) & 1);
              local_720._12_4_ = (uint)bVar89 * (int)fVar159 | (uint)!bVar89 * auVar103._12_4_;
              bVar89 = (bool)((byte)(uVar82 >> 4) & 1);
              local_720._16_4_ = (uint)bVar89 * (int)fVar137 | (uint)!bVar89 * auVar103._16_4_;
              bVar89 = (bool)((byte)(uVar82 >> 5) & 1);
              local_720._20_4_ = (uint)bVar89 * (int)fVar138 | (uint)!bVar89 * auVar103._20_4_;
              bVar89 = (bool)((byte)(uVar82 >> 6) & 1);
              local_720._24_4_ = (uint)bVar89 * (int)fVar139 | (uint)!bVar89 * auVar103._24_4_;
              bVar89 = SUB81(uVar82 >> 7,0);
              local_720._28_4_ = (uint)bVar89 * auVar101._28_4_ | (uint)!bVar89 * auVar103._28_4_;
              auVar103 = vsubps_avx(auVar185,auVar52);
              bVar89 = (bool)((byte)(uVar82 >> 1) & 1);
              bVar17 = (bool)((byte)(uVar82 >> 2) & 1);
              bVar18 = (bool)((byte)(uVar82 >> 3) & 1);
              bVar19 = (bool)((byte)(uVar82 >> 4) & 1);
              bVar20 = (bool)((byte)(uVar82 >> 5) & 1);
              bVar21 = (bool)((byte)(uVar82 >> 6) & 1);
              bVar22 = SUB81(uVar82 >> 7,0);
              local_2e0._4_4_ = (uint)bVar89 * (int)fVar176 | (uint)!bVar89 * auVar103._4_4_;
              local_2e0._0_4_ =
                   (uint)(bVar84 & 1) * (int)fVar168 | (uint)!(bool)(bVar84 & 1) * auVar103._0_4_;
              local_2e0._8_4_ = (uint)bVar17 * (int)fVar177 | (uint)!bVar17 * auVar103._8_4_;
              local_2e0._12_4_ = (uint)bVar18 * (int)fVar178 | (uint)!bVar18 * auVar103._12_4_;
              local_2e0._16_4_ = (uint)bVar19 * (int)fVar140 | (uint)!bVar19 * auVar103._16_4_;
              local_2e0._20_4_ = (uint)bVar20 * (int)fVar141 | (uint)!bVar20 * auVar103._20_4_;
              local_2e0._24_4_ = (uint)bVar21 * (int)fVar142 | (uint)!bVar21 * auVar103._24_4_;
              local_2e0._28_4_ = (uint)bVar22 * auVar109._28_4_ | (uint)!bVar22 * auVar103._28_4_;
              local_740 = auVar102;
              goto LAB_01f2673b;
            }
          }
          local_370 = 0;
        }
LAB_01f2673b:
        auVar214 = ZEXT3264(local_620);
        auVar213 = ZEXT3264(local_600);
        auVar212 = ZEXT3264(local_5e0);
        auVar205 = ZEXT3264(auVar108);
        if (local_370 != 0) {
          auVar103 = vsubps_avx(ZEXT1632(auVar10),auVar99);
          auVar93 = vfmadd213ps_fma(auVar103,local_720,auVar99);
          uVar145 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
          auVar28._4_4_ = uVar145;
          auVar28._0_4_ = uVar145;
          auVar28._8_4_ = uVar145;
          auVar28._12_4_ = uVar145;
          auVar28._16_4_ = uVar145;
          auVar28._20_4_ = uVar145;
          auVar28._24_4_ = uVar145;
          auVar28._28_4_ = uVar145;
          auVar103 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar93._12_4_ + auVar93._12_4_,
                                                        CONCAT48(auVar93._8_4_ + auVar93._8_4_,
                                                                 CONCAT44(auVar93._4_4_ +
                                                                          auVar93._4_4_,
                                                                          auVar93._0_4_ +
                                                                          auVar93._0_4_)))),auVar28)
          ;
          uVar146 = vcmpps_avx512vl(local_740,auVar103,6);
          local_370 = local_370 & (byte)uVar146;
          if (local_370 != 0) {
            auVar150._8_4_ = 0xbf800000;
            auVar150._0_8_ = 0xbf800000bf800000;
            auVar150._12_4_ = 0xbf800000;
            auVar150._16_4_ = 0xbf800000;
            auVar150._20_4_ = 0xbf800000;
            auVar150._24_4_ = 0xbf800000;
            auVar150._28_4_ = 0xbf800000;
            auVar29._8_4_ = 0x40000000;
            auVar29._0_8_ = 0x4000000040000000;
            auVar29._12_4_ = 0x40000000;
            auVar29._16_4_ = 0x40000000;
            auVar29._20_4_ = 0x40000000;
            auVar29._24_4_ = 0x40000000;
            auVar29._28_4_ = 0x40000000;
            local_400 = vfmadd132ps_avx512vl(local_2e0,auVar150,auVar29);
            local_2e0 = local_400;
            auVar103 = local_2e0;
            local_3c0 = 0;
            local_3b0 = local_750._0_8_;
            uStack_3a8 = local_750._8_8_;
            local_3a0 = local_510._0_8_;
            uStack_398 = local_510._8_8_;
            local_390 = local_520._0_8_;
            uStack_388 = local_520._8_8_;
            local_380 = local_530._0_8_;
            uStack_378 = local_530._8_8_;
            if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar89 = true, pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar144 = 1.0 / auVar192._0_4_;
                local_360[0] = fVar144 * (local_720._0_4_ + 0.0);
                local_360[1] = fVar144 * (local_720._4_4_ + 1.0);
                local_360[2] = fVar144 * (local_720._8_4_ + 2.0);
                local_360[3] = fVar144 * (local_720._12_4_ + 3.0);
                fStack_350 = fVar144 * (local_720._16_4_ + 4.0);
                fStack_34c = fVar144 * (local_720._20_4_ + 5.0);
                fStack_348 = fVar144 * (local_720._24_4_ + 6.0);
                fStack_344 = local_720._28_4_ + 7.0;
                local_2e0._0_8_ = local_400._0_8_;
                local_2e0._8_8_ = local_400._8_8_;
                local_2e0._16_8_ = local_400._16_8_;
                local_2e0._24_8_ = local_400._24_8_;
                local_340 = local_2e0._0_8_;
                uStack_338 = local_2e0._8_8_;
                uStack_330 = local_2e0._16_8_;
                uStack_328 = local_2e0._24_8_;
                local_320 = local_740;
                local_4a0 = 0;
                uVar88 = (ulong)local_370;
                for (uVar82 = uVar88; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000)
                {
                  local_4a0 = local_4a0 + 1;
                }
                local_4c0 = vpbroadcastd_avx512vl();
                local_760 = local_510._0_4_;
                uStack_75c = local_510._4_4_;
                uStack_758 = local_510._8_8_;
                local_4e0 = vpbroadcastd_avx512vl();
                local_6a0 = local_520._0_8_;
                uStack_698 = local_520._8_8_;
                local_6b0 = local_530._0_4_;
                fStack_6ac = local_530._4_4_;
                fStack_6a8 = local_530._8_4_;
                fStack_6a4 = local_530._12_4_;
                bVar89 = true;
                local_640 = fVar169;
                local_5c0 = auVar108;
                local_420 = local_720;
                local_3e0 = local_740;
                local_3bc = iVar12;
                local_2e0 = auVar103;
                do {
                  auVar210 = auVar211._0_16_;
                  uVar145 = *(undefined4 *)(ray + k * 4 + 0x100);
                  fVar144 = local_360[local_4a0];
                  auVar153._4_4_ = fVar144;
                  auVar153._0_4_ = fVar144;
                  auVar153._8_4_ = fVar144;
                  auVar153._12_4_ = fVar144;
                  local_240._16_4_ = fVar144;
                  local_240._0_16_ = auVar153;
                  local_240._20_4_ = fVar144;
                  local_240._24_4_ = fVar144;
                  local_240._28_4_ = fVar144;
                  local_220 = *(undefined4 *)((long)&local_340 + local_4a0 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + local_4a0 * 4);
                  local_7a0.context = context->user;
                  fVar168 = 1.0 - fVar144;
                  auVar6 = vfnmadd231ss_fma(ZEXT416((uint)(fVar144 * (fVar168 + fVar168))),
                                            ZEXT416((uint)fVar168),ZEXT416((uint)fVar168));
                  auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar153,
                                            ZEXT416(0xc0a00000));
                  auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * fVar144 * 3.0)),
                                            ZEXT416((uint)(fVar144 + fVar144)),auVar93);
                  auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar153,
                                            ZEXT416(0x40000000));
                  auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar168 * fVar168 * -3.0)),
                                            ZEXT416((uint)(fVar168 + fVar168)),auVar93);
                  auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * fVar144)),auVar153,
                                            ZEXT416((uint)(fVar168 * -2.0)));
                  fVar144 = auVar6._0_4_ * 0.5;
                  fVar168 = auVar94._0_4_ * 0.5;
                  fVar176 = auVar93._0_4_ * 0.5;
                  fVar177 = auVar95._0_4_ * 0.5;
                  auVar161._0_4_ = fVar177 * local_6b0;
                  auVar161._4_4_ = fVar177 * fStack_6ac;
                  auVar161._8_4_ = fVar177 * fStack_6a8;
                  auVar161._12_4_ = fVar177 * fStack_6a4;
                  auVar179._4_4_ = fVar176;
                  auVar179._0_4_ = fVar176;
                  auVar179._8_4_ = fVar176;
                  auVar179._12_4_ = fVar176;
                  auVar78._8_8_ = uStack_698;
                  auVar78._0_8_ = local_6a0;
                  auVar93 = vfmadd132ps_fma(auVar179,auVar161,auVar78);
                  auVar162._4_4_ = fVar168;
                  auVar162._0_4_ = fVar168;
                  auVar162._8_4_ = fVar168;
                  auVar162._12_4_ = fVar168;
                  auVar72._4_4_ = uStack_75c;
                  auVar72._0_4_ = local_760;
                  auVar72._8_8_ = uStack_758;
                  auVar93 = vfmadd132ps_fma(auVar162,auVar93,auVar72);
                  auVar147._4_4_ = fVar144;
                  auVar147._0_4_ = fVar144;
                  auVar147._8_4_ = fVar144;
                  auVar147._12_4_ = fVar144;
                  auVar93 = vfmadd132ps_fma(auVar147,auVar93,local_750);
                  local_2a0 = auVar93._0_4_;
                  auVar172._8_4_ = 1;
                  auVar172._0_8_ = 0x100000001;
                  auVar172._12_4_ = 1;
                  auVar172._16_4_ = 1;
                  auVar172._20_4_ = 1;
                  auVar172._24_4_ = 1;
                  auVar172._28_4_ = 1;
                  local_280 = vpermps_avx2(auVar172,ZEXT1632(auVar93));
                  auVar182._8_4_ = 2;
                  auVar182._0_8_ = 0x200000002;
                  auVar182._12_4_ = 2;
                  auVar182._16_4_ = 2;
                  auVar182._20_4_ = 2;
                  auVar182._24_4_ = 2;
                  auVar182._28_4_ = 2;
                  local_260 = vpermps_avx2(auVar182,ZEXT1632(auVar93));
                  uStack_29c = local_2a0;
                  uStack_298 = local_2a0;
                  uStack_294 = local_2a0;
                  uStack_290 = local_2a0;
                  uStack_28c = local_2a0;
                  uStack_288 = local_2a0;
                  uStack_284 = local_2a0;
                  uStack_21c = local_220;
                  uStack_218 = local_220;
                  uStack_214 = local_220;
                  uStack_210 = local_220;
                  uStack_20c = local_220;
                  uStack_208 = local_220;
                  uStack_204 = local_220;
                  local_200 = local_4e0._0_8_;
                  uStack_1f8 = local_4e0._8_8_;
                  uStack_1f0 = local_4e0._16_8_;
                  uStack_1e8 = local_4e0._24_8_;
                  local_1e0 = local_4c0;
                  vpcmpeqd_avx2(local_4c0,local_4c0);
                  local_1c0 = (local_7a0.context)->instID[0];
                  uStack_1bc = local_1c0;
                  uStack_1b8 = local_1c0;
                  uStack_1b4 = local_1c0;
                  uStack_1b0 = local_1c0;
                  uStack_1ac = local_1c0;
                  uStack_1a8 = local_1c0;
                  uStack_1a4 = local_1c0;
                  local_1a0 = (local_7a0.context)->instPrimID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_6e0 = local_2c0._0_8_;
                  uStack_6d8 = local_2c0._8_8_;
                  uStack_6d0 = local_2c0._16_8_;
                  uStack_6c8 = local_2c0._24_8_;
                  local_7a0.valid = (int *)&local_6e0;
                  local_7a0.geometryUserPtr = pGVar13->userPtr;
                  local_7a0.hit = (RTCHitN *)&local_2a0;
                  local_7a0.N = 8;
                  local_480 = (undefined4)uVar88;
                  uStack_47c = (undefined4)(uVar88 >> 0x20);
                  local_7a0.ray = (RTCRayN *)ray;
                  if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar13->occlusionFilterN)(&local_7a0);
                    uVar88 = CONCAT44(uStack_47c,local_480);
                    auVar200 = ZEXT1664(_local_770);
                    auVar205 = ZEXT3264(local_5c0);
                    auVar214 = ZEXT3264(local_620);
                    auVar213 = ZEXT3264(local_600);
                    auVar212 = ZEXT3264(local_5e0);
                    auVar215 = ZEXT3264(local_700);
                    auVar206 = ZEXT3264(local_5a0);
                    auVar209 = ZEXT3264(local_580);
                    auVar208 = ZEXT3264(local_500);
                    auVar207 = ZEXT3264(local_560);
                    auVar93 = vxorps_avx512vl(auVar210,auVar210);
                    auVar211 = ZEXT1664(auVar93);
                    fVar169 = local_640;
                  }
                  auVar93 = auVar211._0_16_;
                  auVar73._8_8_ = uStack_6d8;
                  auVar73._0_8_ = local_6e0;
                  auVar73._16_8_ = uStack_6d0;
                  auVar73._24_8_ = uStack_6c8;
                  if (auVar73 != (undefined1  [32])0x0) {
                    p_Var16 = context->args->filter;
                    if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var16)(&local_7a0);
                      uVar88 = CONCAT44(uStack_47c,local_480);
                      auVar200 = ZEXT1664(_local_770);
                      auVar205 = ZEXT3264(local_5c0);
                      auVar214 = ZEXT3264(local_620);
                      auVar213 = ZEXT3264(local_600);
                      auVar212 = ZEXT3264(local_5e0);
                      auVar215 = ZEXT3264(local_700);
                      auVar206 = ZEXT3264(local_5a0);
                      auVar209 = ZEXT3264(local_580);
                      auVar208 = ZEXT3264(local_500);
                      auVar207 = ZEXT3264(local_560);
                      auVar93 = vxorps_avx512vl(auVar93,auVar93);
                      auVar211 = ZEXT1664(auVar93);
                      fVar169 = local_640;
                    }
                    auVar108 = auVar205._0_32_;
                    auVar74._8_8_ = uStack_6d8;
                    auVar74._0_8_ = local_6e0;
                    auVar74._16_8_ = uStack_6d0;
                    auVar74._24_8_ = uStack_6c8;
                    uVar82 = vptestmd_avx512vl(auVar74,auVar74);
                    auVar103 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar17 = (bool)((byte)uVar82 & 1);
                    auVar125._0_4_ =
                         (uint)bVar17 * auVar103._0_4_ |
                         (uint)!bVar17 * *(int *)(local_7a0.ray + 0x100);
                    bVar17 = (bool)((byte)(uVar82 >> 1) & 1);
                    auVar125._4_4_ =
                         (uint)bVar17 * auVar103._4_4_ |
                         (uint)!bVar17 * *(int *)(local_7a0.ray + 0x104);
                    bVar17 = (bool)((byte)(uVar82 >> 2) & 1);
                    auVar125._8_4_ =
                         (uint)bVar17 * auVar103._8_4_ |
                         (uint)!bVar17 * *(int *)(local_7a0.ray + 0x108);
                    bVar17 = (bool)((byte)(uVar82 >> 3) & 1);
                    auVar125._12_4_ =
                         (uint)bVar17 * auVar103._12_4_ |
                         (uint)!bVar17 * *(int *)(local_7a0.ray + 0x10c);
                    bVar17 = (bool)((byte)(uVar82 >> 4) & 1);
                    auVar125._16_4_ =
                         (uint)bVar17 * auVar103._16_4_ |
                         (uint)!bVar17 * *(int *)(local_7a0.ray + 0x110);
                    bVar17 = (bool)((byte)(uVar82 >> 5) & 1);
                    auVar125._20_4_ =
                         (uint)bVar17 * auVar103._20_4_ |
                         (uint)!bVar17 * *(int *)(local_7a0.ray + 0x114);
                    bVar17 = (bool)((byte)(uVar82 >> 6) & 1);
                    auVar125._24_4_ =
                         (uint)bVar17 * auVar103._24_4_ |
                         (uint)!bVar17 * *(int *)(local_7a0.ray + 0x118);
                    bVar17 = SUB81(uVar82 >> 7,0);
                    auVar125._28_4_ =
                         (uint)bVar17 * auVar103._28_4_ |
                         (uint)!bVar17 * *(int *)(local_7a0.ray + 0x11c);
                    *(undefined1 (*) [32])(local_7a0.ray + 0x100) = auVar125;
                    fVar144 = auVar200._0_4_;
                    if (auVar74 != (undefined1  [32])0x0) break;
                  }
                  auVar108 = auVar205._0_32_;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar145;
                  uVar82 = local_4a0 & 0x3f;
                  local_4a0 = 0;
                  uVar88 = uVar88 ^ 1L << uVar82;
                  for (uVar82 = uVar88; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000
                      ) {
                    local_4a0 = local_4a0 + 1;
                  }
                  bVar89 = uVar88 != 0;
                  fVar144 = auVar200._0_4_;
                } while (bVar89);
              }
              goto LAB_01f26d6c;
            }
          }
        }
        bVar89 = false;
      }
LAB_01f26d6c:
      local_640 = fVar144;
      if (8 < iVar12) {
        auVar103 = vpbroadcastd_avx512vl();
        auVar200 = ZEXT3264(auVar103);
        fStack_498 = 1.0 / (float)local_460._0_4_;
        local_460 = vpbroadcastd_avx512vl();
        local_440 = vpbroadcastd_avx512vl();
        lVar91 = 8;
        fStack_63c = local_640;
        fStack_638 = local_640;
        fStack_634 = local_640;
        fStack_630 = local_640;
        fStack_62c = local_640;
        fStack_628 = local_640;
        fStack_624 = local_640;
        local_5c0 = auVar108;
        fStack_494 = fStack_498;
        fStack_490 = fStack_498;
        fStack_48c = fStack_498;
        fStack_488 = fStack_498;
        fStack_484 = fStack_498;
        local_480 = fVar169;
        uStack_47c = fVar169;
        uStack_478 = fVar169;
        uStack_474 = fVar169;
        uStack_470 = fVar169;
        uStack_46c = fVar169;
        uStack_468 = fVar169;
        uStack_464 = fVar169;
        local_4a0._0_4_ = fStack_498;
        local_4a0._4_4_ = fStack_498;
        do {
          auVar103 = vpbroadcastd_avx512vl();
          auVar104 = vpor_avx2(auVar103,_DAT_0205a920);
          uVar24 = vpcmpgtd_avx512vl(auVar200._0_32_,auVar104);
          auVar103 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar91 * 4 + lVar25);
          auVar102 = *(undefined1 (*) [32])(lVar25 + 0x22307f0 + lVar91 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar25 + 0x2230c74 + lVar91 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar25 + 0x22310f8 + lVar91 * 4);
          local_600 = auVar213._0_32_;
          auVar105 = vmulps_avx512vl(local_600,auVar113);
          local_620 = auVar214._0_32_;
          auVar112 = vmulps_avx512vl(local_620,auVar113);
          auVar53._4_4_ = auVar113._4_4_ * (float)local_100._4_4_;
          auVar53._0_4_ = auVar113._0_4_ * (float)local_100._0_4_;
          auVar53._8_4_ = auVar113._8_4_ * fStack_f8;
          auVar53._12_4_ = auVar113._12_4_ * fStack_f4;
          auVar53._16_4_ = auVar113._16_4_ * fStack_f0;
          auVar53._20_4_ = auVar113._20_4_ * fStack_ec;
          auVar53._24_4_ = auVar113._24_4_ * fStack_e8;
          auVar53._28_4_ = auVar104._28_4_;
          auVar184 = auVar215._0_32_;
          auVar104 = vfmadd231ps_avx512vl(auVar105,auVar114,auVar184);
          local_5e0 = auVar212._0_32_;
          auVar105 = vfmadd231ps_avx512vl(auVar112,auVar114,local_5e0);
          auVar112 = vfmadd231ps_avx512vl(auVar53,auVar114,local_e0);
          auVar181 = auVar209._0_32_;
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,auVar181);
          auVar155 = auVar206._0_32_;
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,auVar155);
          auVar93 = vfmadd231ps_fma(auVar112,auVar102,local_c0);
          auVar158 = auVar207._0_32_;
          auVar101 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar158);
          local_500 = auVar208._0_32_;
          auVar109 = vfmadd231ps_avx512vl(auVar105,auVar103,local_500);
          auVar104 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar91 * 4 + lVar25);
          auVar105 = *(undefined1 (*) [32])(lVar25 + 0x2232c10 + lVar91 * 4);
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar103,local_a0);
          auVar112 = *(undefined1 (*) [32])(lVar25 + 0x2233094 + lVar91 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar25 + 0x2233518 + lVar91 * 4);
          auVar108 = vmulps_avx512vl(local_600,auVar106);
          auVar107 = vmulps_avx512vl(local_620,auVar106);
          auVar54._4_4_ = auVar106._4_4_ * (float)local_100._4_4_;
          auVar54._0_4_ = auVar106._0_4_ * (float)local_100._0_4_;
          auVar54._8_4_ = auVar106._8_4_ * fStack_f8;
          auVar54._12_4_ = auVar106._12_4_ * fStack_f4;
          auVar54._16_4_ = auVar106._16_4_ * fStack_f0;
          auVar54._20_4_ = auVar106._20_4_ * fStack_ec;
          auVar54._24_4_ = auVar106._24_4_ * fStack_e8;
          auVar54._28_4_ = uStack_e4;
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar112,auVar184);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar112,local_5e0);
          auVar110 = vfmadd231ps_avx512vl(auVar54,auVar112,local_e0);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,auVar181);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,auVar155);
          auVar94 = vfmadd231ps_fma(auVar110,auVar105,local_c0);
          auVar110 = vfmadd231ps_avx512vl(auVar108,auVar104,auVar158);
          auVar99 = vfmadd231ps_avx512vl(auVar107,auVar104,local_500);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar104,local_a0);
          auVar100 = vmaxps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar94));
          auVar108 = vsubps_avx(auVar110,auVar101);
          auVar107 = vsubps_avx(auVar99,auVar109);
          auVar111 = vmulps_avx512vl(auVar109,auVar108);
          auVar126 = vmulps_avx512vl(auVar101,auVar107);
          auVar111 = vsubps_avx512vl(auVar111,auVar126);
          auVar126 = vmulps_avx512vl(auVar107,auVar107);
          auVar126 = vfmadd231ps_avx512vl(auVar126,auVar108,auVar108);
          auVar100 = vmulps_avx512vl(auVar100,auVar100);
          auVar100 = vmulps_avx512vl(auVar100,auVar126);
          auVar111 = vmulps_avx512vl(auVar111,auVar111);
          uVar146 = vcmpps_avx512vl(auVar111,auVar100,2);
          local_370 = (byte)uVar24 & (byte)uVar146;
          if (local_370 == 0) {
            auVar205 = ZEXT3264(auVar155);
            auVar215 = ZEXT3264(auVar184);
          }
          else {
            auVar106 = vmulps_avx512vl(local_5c0,auVar106);
            auVar112 = vfmadd213ps_avx512vl(auVar112,local_160,auVar106);
            auVar105 = vfmadd213ps_avx512vl(auVar105,local_140,auVar112);
            auVar104 = vfmadd213ps_avx512vl(auVar104,local_120,auVar105);
            auVar113 = vmulps_avx512vl(local_5c0,auVar113);
            auVar114 = vfmadd213ps_avx512vl(auVar114,local_160,auVar113);
            auVar102 = vfmadd213ps_avx512vl(auVar102,local_140,auVar114);
            auVar105 = vfmadd213ps_avx512vl(auVar103,local_120,auVar102);
            auVar103 = *(undefined1 (*) [32])(lVar25 + 0x223157c + lVar91 * 4);
            auVar102 = *(undefined1 (*) [32])(lVar25 + 0x2231a00 + lVar91 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar25 + 0x2231e84 + lVar91 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar25 + 0x2232308 + lVar91 * 4);
            auVar112 = vmulps_avx512vl(local_600,auVar113);
            auVar106 = vmulps_avx512vl(local_620,auVar113);
            auVar113 = vmulps_avx512vl(local_5c0,auVar113);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar114,auVar184);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar114,local_5e0);
            auVar114 = vfmadd231ps_avx512vl(auVar113,local_160,auVar114);
            auVar113 = vfmadd231ps_avx512vl(auVar112,auVar102,auVar181);
            auVar112 = vfmadd231ps_avx512vl(auVar106,auVar102,auVar155);
            auVar102 = vfmadd231ps_avx512vl(auVar114,local_140,auVar102);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar103,auVar158);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar103,local_500);
            auVar106 = vfmadd231ps_avx512vl(auVar102,local_120,auVar103);
            auVar103 = *(undefined1 (*) [32])(lVar25 + 0x223399c + lVar91 * 4);
            auVar102 = *(undefined1 (*) [32])(lVar25 + 0x22342a4 + lVar91 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar25 + 0x2234728 + lVar91 * 4);
            auVar100 = vmulps_avx512vl(local_600,auVar114);
            auVar111 = vmulps_avx512vl(local_620,auVar114);
            auVar114 = vmulps_avx512vl(local_5c0,auVar114);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar102,auVar184);
            auVar111 = vfmadd231ps_avx512vl(auVar111,auVar102,local_5e0);
            auVar114 = vfmadd231ps_avx512vl(auVar114,local_160,auVar102);
            auVar102 = *(undefined1 (*) [32])(lVar25 + 0x2233e20 + lVar91 * 4);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar102,auVar181);
            auVar111 = vfmadd231ps_avx512vl(auVar111,auVar102,auVar155);
            auVar102 = vfmadd231ps_avx512vl(auVar114,local_140,auVar102);
            auVar114 = vfmadd231ps_avx512vl(auVar100,auVar103,auVar158);
            auVar100 = vfmadd231ps_avx512vl(auVar111,auVar103,local_500);
            auVar102 = vfmadd231ps_avx512vl(auVar102,local_120,auVar103);
            auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar113,auVar111);
            vandps_avx512vl(auVar112,auVar111);
            auVar103 = vmaxps_avx(auVar111,auVar111);
            vandps_avx512vl(auVar106,auVar111);
            auVar103 = vmaxps_avx(auVar103,auVar111);
            auVar80._4_4_ = fStack_63c;
            auVar80._0_4_ = local_640;
            auVar80._8_4_ = fStack_638;
            auVar80._12_4_ = fStack_634;
            auVar80._16_4_ = fStack_630;
            auVar80._20_4_ = fStack_62c;
            auVar80._24_4_ = fStack_628;
            auVar80._28_4_ = fStack_624;
            uVar82 = vcmpps_avx512vl(auVar103,auVar80,1);
            bVar17 = (bool)((byte)uVar82 & 1);
            auVar127._0_4_ = (float)((uint)bVar17 * auVar108._0_4_ | (uint)!bVar17 * auVar113._0_4_)
            ;
            bVar17 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar127._4_4_ = (float)((uint)bVar17 * auVar108._4_4_ | (uint)!bVar17 * auVar113._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar127._8_4_ = (float)((uint)bVar17 * auVar108._8_4_ | (uint)!bVar17 * auVar113._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar127._12_4_ =
                 (float)((uint)bVar17 * auVar108._12_4_ | (uint)!bVar17 * auVar113._12_4_);
            bVar17 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar127._16_4_ =
                 (float)((uint)bVar17 * auVar108._16_4_ | (uint)!bVar17 * auVar113._16_4_);
            bVar17 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar127._20_4_ =
                 (float)((uint)bVar17 * auVar108._20_4_ | (uint)!bVar17 * auVar113._20_4_);
            bVar17 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar127._24_4_ =
                 (float)((uint)bVar17 * auVar108._24_4_ | (uint)!bVar17 * auVar113._24_4_);
            bVar17 = SUB81(uVar82 >> 7,0);
            auVar127._28_4_ = (uint)bVar17 * auVar108._28_4_ | (uint)!bVar17 * auVar113._28_4_;
            bVar17 = (bool)((byte)uVar82 & 1);
            auVar128._0_4_ = (float)((uint)bVar17 * auVar107._0_4_ | (uint)!bVar17 * auVar112._0_4_)
            ;
            bVar17 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar128._4_4_ = (float)((uint)bVar17 * auVar107._4_4_ | (uint)!bVar17 * auVar112._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar128._8_4_ = (float)((uint)bVar17 * auVar107._8_4_ | (uint)!bVar17 * auVar112._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar128._12_4_ =
                 (float)((uint)bVar17 * auVar107._12_4_ | (uint)!bVar17 * auVar112._12_4_);
            bVar17 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar128._16_4_ =
                 (float)((uint)bVar17 * auVar107._16_4_ | (uint)!bVar17 * auVar112._16_4_);
            bVar17 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar128._20_4_ =
                 (float)((uint)bVar17 * auVar107._20_4_ | (uint)!bVar17 * auVar112._20_4_);
            bVar17 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar128._24_4_ =
                 (float)((uint)bVar17 * auVar107._24_4_ | (uint)!bVar17 * auVar112._24_4_);
            bVar17 = SUB81(uVar82 >> 7,0);
            auVar128._28_4_ = (uint)bVar17 * auVar107._28_4_ | (uint)!bVar17 * auVar112._28_4_;
            vandps_avx512vl(auVar114,auVar111);
            vandps_avx512vl(auVar100,auVar111);
            auVar103 = vmaxps_avx(auVar128,auVar128);
            vandps_avx512vl(auVar102,auVar111);
            auVar103 = vmaxps_avx(auVar103,auVar128);
            uVar82 = vcmpps_avx512vl(auVar103,auVar80,1);
            bVar17 = (bool)((byte)uVar82 & 1);
            auVar129._0_4_ = (uint)bVar17 * auVar108._0_4_ | (uint)!bVar17 * auVar114._0_4_;
            bVar17 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar129._4_4_ = (uint)bVar17 * auVar108._4_4_ | (uint)!bVar17 * auVar114._4_4_;
            bVar17 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar129._8_4_ = (uint)bVar17 * auVar108._8_4_ | (uint)!bVar17 * auVar114._8_4_;
            bVar17 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar129._12_4_ = (uint)bVar17 * auVar108._12_4_ | (uint)!bVar17 * auVar114._12_4_;
            bVar17 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar129._16_4_ = (uint)bVar17 * auVar108._16_4_ | (uint)!bVar17 * auVar114._16_4_;
            bVar17 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar129._20_4_ = (uint)bVar17 * auVar108._20_4_ | (uint)!bVar17 * auVar114._20_4_;
            bVar17 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar129._24_4_ = (uint)bVar17 * auVar108._24_4_ | (uint)!bVar17 * auVar114._24_4_;
            bVar17 = SUB81(uVar82 >> 7,0);
            auVar129._28_4_ = (uint)bVar17 * auVar108._28_4_ | (uint)!bVar17 * auVar114._28_4_;
            bVar17 = (bool)((byte)uVar82 & 1);
            auVar130._0_4_ = (float)((uint)bVar17 * auVar107._0_4_ | (uint)!bVar17 * auVar100._0_4_)
            ;
            bVar17 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar17 * auVar107._4_4_ | (uint)!bVar17 * auVar100._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar17 * auVar107._8_4_ | (uint)!bVar17 * auVar100._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar17 * auVar107._12_4_ | (uint)!bVar17 * auVar100._12_4_);
            bVar17 = (bool)((byte)(uVar82 >> 4) & 1);
            auVar130._16_4_ =
                 (float)((uint)bVar17 * auVar107._16_4_ | (uint)!bVar17 * auVar100._16_4_);
            bVar17 = (bool)((byte)(uVar82 >> 5) & 1);
            auVar130._20_4_ =
                 (float)((uint)bVar17 * auVar107._20_4_ | (uint)!bVar17 * auVar100._20_4_);
            bVar17 = (bool)((byte)(uVar82 >> 6) & 1);
            auVar130._24_4_ =
                 (float)((uint)bVar17 * auVar107._24_4_ | (uint)!bVar17 * auVar100._24_4_);
            bVar17 = SUB81(uVar82 >> 7,0);
            auVar130._28_4_ = (uint)bVar17 * auVar107._28_4_ | (uint)!bVar17 * auVar100._28_4_;
            auVar194._8_4_ = 0x80000000;
            auVar194._0_8_ = 0x8000000080000000;
            auVar194._12_4_ = 0x80000000;
            auVar194._16_4_ = 0x80000000;
            auVar194._20_4_ = 0x80000000;
            auVar194._24_4_ = 0x80000000;
            auVar194._28_4_ = 0x80000000;
            auVar103 = vxorps_avx512vl(auVar129,auVar194);
            auVar100 = auVar211._0_32_;
            auVar102 = vfmadd213ps_avx512vl(auVar127,auVar127,auVar100);
            auVar95 = vfmadd231ps_fma(auVar102,auVar128,auVar128);
            auVar102 = vrsqrt14ps_avx512vl(ZEXT1632(auVar95));
            auVar204._8_4_ = 0xbf000000;
            auVar204._0_8_ = 0xbf000000bf000000;
            auVar204._12_4_ = 0xbf000000;
            auVar204._16_4_ = 0xbf000000;
            auVar204._20_4_ = 0xbf000000;
            auVar204._24_4_ = 0xbf000000;
            auVar204._28_4_ = 0xbf000000;
            fVar169 = auVar102._0_4_;
            fVar144 = auVar102._4_4_;
            fVar168 = auVar102._8_4_;
            fVar176 = auVar102._12_4_;
            fVar177 = auVar102._16_4_;
            fVar178 = auVar102._20_4_;
            fVar160 = auVar102._24_4_;
            auVar55._4_4_ = fVar144 * fVar144 * fVar144 * auVar95._4_4_ * -0.5;
            auVar55._0_4_ = fVar169 * fVar169 * fVar169 * auVar95._0_4_ * -0.5;
            auVar55._8_4_ = fVar168 * fVar168 * fVar168 * auVar95._8_4_ * -0.5;
            auVar55._12_4_ = fVar176 * fVar176 * fVar176 * auVar95._12_4_ * -0.5;
            auVar55._16_4_ = fVar177 * fVar177 * fVar177 * -0.0;
            auVar55._20_4_ = fVar178 * fVar178 * fVar178 * -0.0;
            auVar55._24_4_ = fVar160 * fVar160 * fVar160 * -0.0;
            auVar55._28_4_ = auVar128._28_4_;
            auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar102 = vfmadd231ps_avx512vl(auVar55,auVar114,auVar102);
            auVar56._4_4_ = auVar128._4_4_ * auVar102._4_4_;
            auVar56._0_4_ = auVar128._0_4_ * auVar102._0_4_;
            auVar56._8_4_ = auVar128._8_4_ * auVar102._8_4_;
            auVar56._12_4_ = auVar128._12_4_ * auVar102._12_4_;
            auVar56._16_4_ = auVar128._16_4_ * auVar102._16_4_;
            auVar56._20_4_ = auVar128._20_4_ * auVar102._20_4_;
            auVar56._24_4_ = auVar128._24_4_ * auVar102._24_4_;
            auVar56._28_4_ = 0;
            auVar57._4_4_ = auVar102._4_4_ * -auVar127._4_4_;
            auVar57._0_4_ = auVar102._0_4_ * -auVar127._0_4_;
            auVar57._8_4_ = auVar102._8_4_ * -auVar127._8_4_;
            auVar57._12_4_ = auVar102._12_4_ * -auVar127._12_4_;
            auVar57._16_4_ = auVar102._16_4_ * -auVar127._16_4_;
            auVar57._20_4_ = auVar102._20_4_ * -auVar127._20_4_;
            auVar57._24_4_ = auVar102._24_4_ * -auVar127._24_4_;
            auVar57._28_4_ = auVar128._28_4_;
            auVar113 = vmulps_avx512vl(auVar102,auVar100);
            auVar102 = vfmadd213ps_avx512vl(auVar129,auVar129,auVar100);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar130,auVar130);
            auVar112 = vrsqrt14ps_avx512vl(auVar102);
            auVar102 = vmulps_avx512vl(auVar102,auVar204);
            fVar169 = auVar112._0_4_;
            fVar144 = auVar112._4_4_;
            fVar168 = auVar112._8_4_;
            fVar176 = auVar112._12_4_;
            fVar177 = auVar112._16_4_;
            fVar178 = auVar112._20_4_;
            fVar160 = auVar112._24_4_;
            auVar58._4_4_ = fVar144 * fVar144 * fVar144 * auVar102._4_4_;
            auVar58._0_4_ = fVar169 * fVar169 * fVar169 * auVar102._0_4_;
            auVar58._8_4_ = fVar168 * fVar168 * fVar168 * auVar102._8_4_;
            auVar58._12_4_ = fVar176 * fVar176 * fVar176 * auVar102._12_4_;
            auVar58._16_4_ = fVar177 * fVar177 * fVar177 * auVar102._16_4_;
            auVar58._20_4_ = fVar178 * fVar178 * fVar178 * auVar102._20_4_;
            auVar58._24_4_ = fVar160 * fVar160 * fVar160 * auVar102._24_4_;
            auVar58._28_4_ = auVar102._28_4_;
            auVar102 = vfmadd231ps_avx512vl(auVar58,auVar114,auVar112);
            auVar59._4_4_ = auVar130._4_4_ * auVar102._4_4_;
            auVar59._0_4_ = auVar130._0_4_ * auVar102._0_4_;
            auVar59._8_4_ = auVar130._8_4_ * auVar102._8_4_;
            auVar59._12_4_ = auVar130._12_4_ * auVar102._12_4_;
            auVar59._16_4_ = auVar130._16_4_ * auVar102._16_4_;
            auVar59._20_4_ = auVar130._20_4_ * auVar102._20_4_;
            auVar59._24_4_ = auVar130._24_4_ * auVar102._24_4_;
            auVar59._28_4_ = auVar112._28_4_;
            auVar60._4_4_ = auVar102._4_4_ * auVar103._4_4_;
            auVar60._0_4_ = auVar102._0_4_ * auVar103._0_4_;
            auVar60._8_4_ = auVar102._8_4_ * auVar103._8_4_;
            auVar60._12_4_ = auVar102._12_4_ * auVar103._12_4_;
            auVar60._16_4_ = auVar102._16_4_ * auVar103._16_4_;
            auVar60._20_4_ = auVar102._20_4_ * auVar103._20_4_;
            auVar60._24_4_ = auVar102._24_4_ * auVar103._24_4_;
            auVar60._28_4_ = auVar103._28_4_;
            auVar103 = vmulps_avx512vl(auVar102,auVar100);
            auVar95 = vfmadd213ps_fma(auVar56,ZEXT1632(auVar93),auVar101);
            auVar102 = ZEXT1632(auVar93);
            auVar6 = vfmadd213ps_fma(auVar57,auVar102,auVar109);
            auVar114 = vfmadd213ps_avx512vl(auVar113,auVar102,auVar105);
            auVar112 = vfmadd213ps_avx512vl(auVar59,ZEXT1632(auVar94),auVar110);
            auVar10 = vfnmadd213ps_fma(auVar56,auVar102,auVar101);
            auVar106 = ZEXT1632(auVar94);
            auVar210 = vfmadd213ps_fma(auVar60,auVar106,auVar99);
            auVar96 = vfnmadd213ps_fma(auVar57,auVar102,auVar109);
            auVar7 = vfmadd213ps_fma(auVar103,auVar106,auVar104);
            auVar109 = ZEXT1632(auVar93);
            auVar98 = vfnmadd231ps_fma(auVar105,auVar109,auVar113);
            auVar97 = vfnmadd213ps_fma(auVar59,auVar106,auVar110);
            auVar152 = vfnmadd213ps_fma(auVar60,auVar106,auVar99);
            auVar156 = vfnmadd231ps_fma(auVar104,ZEXT1632(auVar94),auVar103);
            auVar104 = vsubps_avx512vl(auVar112,ZEXT1632(auVar10));
            auVar103 = vsubps_avx(ZEXT1632(auVar210),ZEXT1632(auVar96));
            auVar102 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar98));
            auVar61._4_4_ = auVar103._4_4_ * auVar98._4_4_;
            auVar61._0_4_ = auVar103._0_4_ * auVar98._0_4_;
            auVar61._8_4_ = auVar103._8_4_ * auVar98._8_4_;
            auVar61._12_4_ = auVar103._12_4_ * auVar98._12_4_;
            auVar61._16_4_ = auVar103._16_4_ * 0.0;
            auVar61._20_4_ = auVar103._20_4_ * 0.0;
            auVar61._24_4_ = auVar103._24_4_ * 0.0;
            auVar61._28_4_ = auVar113._28_4_;
            auVar93 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar96),auVar102);
            auVar62._4_4_ = auVar102._4_4_ * auVar10._4_4_;
            auVar62._0_4_ = auVar102._0_4_ * auVar10._0_4_;
            auVar62._8_4_ = auVar102._8_4_ * auVar10._8_4_;
            auVar62._12_4_ = auVar102._12_4_ * auVar10._12_4_;
            auVar62._16_4_ = auVar102._16_4_ * 0.0;
            auVar62._20_4_ = auVar102._20_4_ * 0.0;
            auVar62._24_4_ = auVar102._24_4_ * 0.0;
            auVar62._28_4_ = auVar102._28_4_;
            auVar8 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar98),auVar104);
            auVar63._4_4_ = auVar96._4_4_ * auVar104._4_4_;
            auVar63._0_4_ = auVar96._0_4_ * auVar104._0_4_;
            auVar63._8_4_ = auVar96._8_4_ * auVar104._8_4_;
            auVar63._12_4_ = auVar96._12_4_ * auVar104._12_4_;
            auVar63._16_4_ = auVar104._16_4_ * 0.0;
            auVar63._20_4_ = auVar104._20_4_ * 0.0;
            auVar63._24_4_ = auVar104._24_4_ * 0.0;
            auVar63._28_4_ = auVar104._28_4_;
            auVar9 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar10),auVar103);
            auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar100,ZEXT1632(auVar8));
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar100,ZEXT1632(auVar93));
            uVar82 = vcmpps_avx512vl(auVar103,auVar100,2);
            bVar84 = (byte)uVar82;
            fVar159 = (float)((uint)(bVar84 & 1) * auVar95._0_4_ |
                             (uint)!(bool)(bVar84 & 1) * auVar97._0_4_);
            bVar17 = (bool)((byte)(uVar82 >> 1) & 1);
            fVar138 = (float)((uint)bVar17 * auVar95._4_4_ | (uint)!bVar17 * auVar97._4_4_);
            bVar17 = (bool)((byte)(uVar82 >> 2) & 1);
            fVar140 = (float)((uint)bVar17 * auVar95._8_4_ | (uint)!bVar17 * auVar97._8_4_);
            bVar17 = (bool)((byte)(uVar82 >> 3) & 1);
            fVar142 = (float)((uint)bVar17 * auVar95._12_4_ | (uint)!bVar17 * auVar97._12_4_);
            auVar106 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar140,CONCAT44(fVar138,fVar159))));
            fVar137 = (float)((uint)(bVar84 & 1) * auVar6._0_4_ |
                             (uint)!(bool)(bVar84 & 1) * auVar152._0_4_);
            bVar17 = (bool)((byte)(uVar82 >> 1) & 1);
            fVar139 = (float)((uint)bVar17 * auVar6._4_4_ | (uint)!bVar17 * auVar152._4_4_);
            bVar17 = (bool)((byte)(uVar82 >> 2) & 1);
            fVar141 = (float)((uint)bVar17 * auVar6._8_4_ | (uint)!bVar17 * auVar152._8_4_);
            bVar17 = (bool)((byte)(uVar82 >> 3) & 1);
            fVar143 = (float)((uint)bVar17 * auVar6._12_4_ | (uint)!bVar17 * auVar152._12_4_);
            auVar108 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar141,CONCAT44(fVar139,fVar137))));
            auVar131._0_4_ =
                 (float)((uint)(bVar84 & 1) * auVar114._0_4_ |
                        (uint)!(bool)(bVar84 & 1) * auVar156._0_4_);
            bVar17 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar131._4_4_ = (float)((uint)bVar17 * auVar114._4_4_ | (uint)!bVar17 * auVar156._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar131._8_4_ = (float)((uint)bVar17 * auVar114._8_4_ | (uint)!bVar17 * auVar156._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar131._12_4_ =
                 (float)((uint)bVar17 * auVar114._12_4_ | (uint)!bVar17 * auVar156._12_4_);
            fVar144 = (float)((uint)((byte)(uVar82 >> 4) & 1) * auVar114._16_4_);
            auVar131._16_4_ = fVar144;
            fVar169 = (float)((uint)((byte)(uVar82 >> 5) & 1) * auVar114._20_4_);
            auVar131._20_4_ = fVar169;
            fVar168 = (float)((uint)((byte)(uVar82 >> 6) & 1) * auVar114._24_4_);
            auVar131._24_4_ = fVar168;
            iVar1 = (uint)(byte)(uVar82 >> 7) * auVar114._28_4_;
            auVar131._28_4_ = iVar1;
            auVar103 = vblendmps_avx512vl(ZEXT1632(auVar10),auVar112);
            auVar132._0_4_ =
                 (uint)(bVar84 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar93._0_4_;
            bVar17 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar132._4_4_ = (uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * auVar93._4_4_;
            bVar17 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar132._8_4_ = (uint)bVar17 * auVar103._8_4_ | (uint)!bVar17 * auVar93._8_4_;
            bVar17 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar132._12_4_ = (uint)bVar17 * auVar103._12_4_ | (uint)!bVar17 * auVar93._12_4_;
            auVar132._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * auVar103._16_4_;
            auVar132._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * auVar103._20_4_;
            auVar132._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * auVar103._24_4_;
            auVar132._28_4_ = (uint)(byte)(uVar82 >> 7) * auVar103._28_4_;
            auVar103 = vblendmps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar210));
            auVar133._0_4_ =
                 (float)((uint)(bVar84 & 1) * auVar103._0_4_ |
                        (uint)!(bool)(bVar84 & 1) * auVar95._0_4_);
            bVar17 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar133._4_4_ = (float)((uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * auVar95._4_4_);
            bVar17 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar133._8_4_ = (float)((uint)bVar17 * auVar103._8_4_ | (uint)!bVar17 * auVar95._8_4_);
            bVar17 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar133._12_4_ =
                 (float)((uint)bVar17 * auVar103._12_4_ | (uint)!bVar17 * auVar95._12_4_);
            fVar176 = (float)((uint)((byte)(uVar82 >> 4) & 1) * auVar103._16_4_);
            auVar133._16_4_ = fVar176;
            fVar178 = (float)((uint)((byte)(uVar82 >> 5) & 1) * auVar103._20_4_);
            auVar133._20_4_ = fVar178;
            fVar177 = (float)((uint)((byte)(uVar82 >> 6) & 1) * auVar103._24_4_);
            auVar133._24_4_ = fVar177;
            auVar133._28_4_ = (uint)(byte)(uVar82 >> 7) * auVar103._28_4_;
            auVar103 = vblendmps_avx512vl(ZEXT1632(auVar98),ZEXT1632(auVar7));
            auVar134._0_4_ =
                 (float)((uint)(bVar84 & 1) * auVar103._0_4_ |
                        (uint)!(bool)(bVar84 & 1) * auVar6._0_4_);
            bVar17 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar134._4_4_ = (float)((uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * auVar6._4_4_);
            bVar17 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar134._8_4_ = (float)((uint)bVar17 * auVar103._8_4_ | (uint)!bVar17 * auVar6._8_4_);
            bVar17 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar134._12_4_ =
                 (float)((uint)bVar17 * auVar103._12_4_ | (uint)!bVar17 * auVar6._12_4_);
            fVar92 = (float)((uint)((byte)(uVar82 >> 4) & 1) * auVar103._16_4_);
            auVar134._16_4_ = fVar92;
            fVar167 = (float)((uint)((byte)(uVar82 >> 5) & 1) * auVar103._20_4_);
            auVar134._20_4_ = fVar167;
            fVar160 = (float)((uint)((byte)(uVar82 >> 6) & 1) * auVar103._24_4_);
            auVar134._24_4_ = fVar160;
            iVar2 = (uint)(byte)(uVar82 >> 7) * auVar103._28_4_;
            auVar134._28_4_ = iVar2;
            auVar135._0_4_ =
                 (uint)(bVar84 & 1) * (int)auVar10._0_4_ |
                 (uint)!(bool)(bVar84 & 1) * auVar112._0_4_;
            bVar17 = (bool)((byte)(uVar82 >> 1) & 1);
            auVar135._4_4_ = (uint)bVar17 * (int)auVar10._4_4_ | (uint)!bVar17 * auVar112._4_4_;
            bVar17 = (bool)((byte)(uVar82 >> 2) & 1);
            auVar135._8_4_ = (uint)bVar17 * (int)auVar10._8_4_ | (uint)!bVar17 * auVar112._8_4_;
            bVar17 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar135._12_4_ = (uint)bVar17 * (int)auVar10._12_4_ | (uint)!bVar17 * auVar112._12_4_;
            auVar135._16_4_ = (uint)!(bool)((byte)(uVar82 >> 4) & 1) * auVar112._16_4_;
            auVar135._20_4_ = (uint)!(bool)((byte)(uVar82 >> 5) & 1) * auVar112._20_4_;
            auVar135._24_4_ = (uint)!(bool)((byte)(uVar82 >> 6) & 1) * auVar112._24_4_;
            auVar135._28_4_ = (uint)!SUB81(uVar82 >> 7,0) * auVar112._28_4_;
            bVar17 = (bool)((byte)(uVar82 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar82 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar82 >> 3) & 1);
            bVar18 = (bool)((byte)(uVar82 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar82 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar82 >> 3) & 1);
            auVar112 = vsubps_avx512vl(auVar135,auVar106);
            auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar96._12_4_ |
                                                     (uint)!bVar21 * auVar210._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar96._8_4_ |
                                                              (uint)!bVar19 * auVar210._8_4_,
                                                              CONCAT44((uint)bVar17 *
                                                                       (int)auVar96._4_4_ |
                                                                       (uint)!bVar17 *
                                                                       auVar210._4_4_,
                                                                       (uint)(bVar84 & 1) *
                                                                       (int)auVar96._0_4_ |
                                                                       (uint)!(bool)(bVar84 & 1) *
                                                                       auVar210._0_4_)))),auVar108);
            auVar114 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar98._12_4_ |
                                                     (uint)!bVar22 * auVar7._12_4_,
                                                     CONCAT48((uint)bVar20 * (int)auVar98._8_4_ |
                                                              (uint)!bVar20 * auVar7._8_4_,
                                                              CONCAT44((uint)bVar18 *
                                                                       (int)auVar98._4_4_ |
                                                                       (uint)!bVar18 * auVar7._4_4_,
                                                                       (uint)(bVar84 & 1) *
                                                                       (int)auVar98._0_4_ |
                                                                       (uint)!(bool)(bVar84 & 1) *
                                                                       auVar7._0_4_)))),auVar131);
            auVar113 = vsubps_avx(auVar106,auVar132);
            auVar104 = vsubps_avx(auVar108,auVar133);
            auVar105 = vsubps_avx(auVar131,auVar134);
            auVar64._4_4_ = auVar114._4_4_ * fVar138;
            auVar64._0_4_ = auVar114._0_4_ * fVar159;
            auVar64._8_4_ = auVar114._8_4_ * fVar140;
            auVar64._12_4_ = auVar114._12_4_ * fVar142;
            auVar64._16_4_ = auVar114._16_4_ * 0.0;
            auVar64._20_4_ = auVar114._20_4_ * 0.0;
            auVar64._24_4_ = auVar114._24_4_ * 0.0;
            auVar64._28_4_ = 0;
            auVar93 = vfmsub231ps_fma(auVar64,auVar131,auVar112);
            auVar166._0_4_ = fVar137 * auVar112._0_4_;
            auVar166._4_4_ = fVar139 * auVar112._4_4_;
            auVar166._8_4_ = fVar141 * auVar112._8_4_;
            auVar166._12_4_ = fVar143 * auVar112._12_4_;
            auVar166._16_4_ = auVar112._16_4_ * 0.0;
            auVar166._20_4_ = auVar112._20_4_ * 0.0;
            auVar166._24_4_ = auVar112._24_4_ * 0.0;
            auVar166._28_4_ = 0;
            auVar95 = vfmsub231ps_fma(auVar166,auVar106,auVar102);
            auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar100,ZEXT1632(auVar93));
            auVar173._0_4_ = auVar102._0_4_ * auVar131._0_4_;
            auVar173._4_4_ = auVar102._4_4_ * auVar131._4_4_;
            auVar173._8_4_ = auVar102._8_4_ * auVar131._8_4_;
            auVar173._12_4_ = auVar102._12_4_ * auVar131._12_4_;
            auVar173._16_4_ = auVar102._16_4_ * fVar144;
            auVar173._20_4_ = auVar102._20_4_ * fVar169;
            auVar173._24_4_ = auVar102._24_4_ * fVar168;
            auVar173._28_4_ = 0;
            auVar93 = vfmsub231ps_fma(auVar173,auVar108,auVar114);
            auVar107 = vfmadd231ps_avx512vl(auVar103,auVar100,ZEXT1632(auVar93));
            auVar103 = vmulps_avx512vl(auVar105,auVar132);
            auVar103 = vfmsub231ps_avx512vl(auVar103,auVar113,auVar134);
            auVar65._4_4_ = auVar104._4_4_ * auVar134._4_4_;
            auVar65._0_4_ = auVar104._0_4_ * auVar134._0_4_;
            auVar65._8_4_ = auVar104._8_4_ * auVar134._8_4_;
            auVar65._12_4_ = auVar104._12_4_ * auVar134._12_4_;
            auVar65._16_4_ = auVar104._16_4_ * fVar92;
            auVar65._20_4_ = auVar104._20_4_ * fVar167;
            auVar65._24_4_ = auVar104._24_4_ * fVar160;
            auVar65._28_4_ = iVar2;
            auVar93 = vfmsub231ps_fma(auVar65,auVar133,auVar105);
            auVar174._0_4_ = auVar133._0_4_ * auVar113._0_4_;
            auVar174._4_4_ = auVar133._4_4_ * auVar113._4_4_;
            auVar174._8_4_ = auVar133._8_4_ * auVar113._8_4_;
            auVar174._12_4_ = auVar133._12_4_ * auVar113._12_4_;
            auVar174._16_4_ = fVar176 * auVar113._16_4_;
            auVar174._20_4_ = fVar178 * auVar113._20_4_;
            auVar174._24_4_ = fVar177 * auVar113._24_4_;
            auVar174._28_4_ = 0;
            auVar95 = vfmsub231ps_fma(auVar174,auVar104,auVar132);
            auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar100,auVar103);
            auVar101 = vfmadd231ps_avx512vl(auVar103,auVar100,ZEXT1632(auVar93));
            auVar103 = vmaxps_avx(auVar107,auVar101);
            uVar146 = vcmpps_avx512vl(auVar103,auVar100,2);
            local_370 = local_370 & (byte)uVar146;
            auVar205 = ZEXT3264(auVar155);
            if (local_370 == 0) {
LAB_01f279a0:
              local_370 = 0;
            }
            else {
              auVar66._4_4_ = auVar105._4_4_ * auVar102._4_4_;
              auVar66._0_4_ = auVar105._0_4_ * auVar102._0_4_;
              auVar66._8_4_ = auVar105._8_4_ * auVar102._8_4_;
              auVar66._12_4_ = auVar105._12_4_ * auVar102._12_4_;
              auVar66._16_4_ = auVar105._16_4_ * auVar102._16_4_;
              auVar66._20_4_ = auVar105._20_4_ * auVar102._20_4_;
              auVar66._24_4_ = auVar105._24_4_ * auVar102._24_4_;
              auVar66._28_4_ = auVar103._28_4_;
              auVar6 = vfmsub231ps_fma(auVar66,auVar104,auVar114);
              auVar67._4_4_ = auVar114._4_4_ * auVar113._4_4_;
              auVar67._0_4_ = auVar114._0_4_ * auVar113._0_4_;
              auVar67._8_4_ = auVar114._8_4_ * auVar113._8_4_;
              auVar67._12_4_ = auVar114._12_4_ * auVar113._12_4_;
              auVar67._16_4_ = auVar114._16_4_ * auVar113._16_4_;
              auVar67._20_4_ = auVar114._20_4_ * auVar113._20_4_;
              auVar67._24_4_ = auVar114._24_4_ * auVar113._24_4_;
              auVar67._28_4_ = auVar114._28_4_;
              auVar95 = vfmsub231ps_fma(auVar67,auVar112,auVar105);
              auVar68._4_4_ = auVar104._4_4_ * auVar112._4_4_;
              auVar68._0_4_ = auVar104._0_4_ * auVar112._0_4_;
              auVar68._8_4_ = auVar104._8_4_ * auVar112._8_4_;
              auVar68._12_4_ = auVar104._12_4_ * auVar112._12_4_;
              auVar68._16_4_ = auVar104._16_4_ * auVar112._16_4_;
              auVar68._20_4_ = auVar104._20_4_ * auVar112._20_4_;
              auVar68._24_4_ = auVar104._24_4_ * auVar112._24_4_;
              auVar68._28_4_ = auVar104._28_4_;
              auVar210 = vfmsub231ps_fma(auVar68,auVar113,auVar102);
              auVar93 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar95),ZEXT1632(auVar210));
              auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar6),auVar100);
              auVar102 = vrcp14ps_avx512vl(auVar103);
              auVar31._8_4_ = 0x3f800000;
              auVar31._0_8_ = &DAT_3f8000003f800000;
              auVar31._12_4_ = 0x3f800000;
              auVar31._16_4_ = 0x3f800000;
              auVar31._20_4_ = 0x3f800000;
              auVar31._24_4_ = 0x3f800000;
              auVar31._28_4_ = 0x3f800000;
              auVar114 = vfnmadd213ps_avx512vl(auVar102,auVar103,auVar31);
              auVar93 = vfmadd132ps_fma(auVar114,auVar102,auVar102);
              auVar69._4_4_ = auVar210._4_4_ * auVar131._4_4_;
              auVar69._0_4_ = auVar210._0_4_ * auVar131._0_4_;
              auVar69._8_4_ = auVar210._8_4_ * auVar131._8_4_;
              auVar69._12_4_ = auVar210._12_4_ * auVar131._12_4_;
              auVar69._16_4_ = fVar144 * 0.0;
              auVar69._20_4_ = fVar169 * 0.0;
              auVar69._24_4_ = fVar168 * 0.0;
              auVar69._28_4_ = iVar1;
              auVar95 = vfmadd231ps_fma(auVar69,auVar108,ZEXT1632(auVar95));
              auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar106,ZEXT1632(auVar6));
              fVar169 = auVar93._0_4_;
              fVar144 = auVar93._4_4_;
              fVar168 = auVar93._8_4_;
              fVar176 = auVar93._12_4_;
              auVar102 = ZEXT1632(CONCAT412(auVar95._12_4_ * fVar176,
                                            CONCAT48(auVar95._8_4_ * fVar168,
                                                     CONCAT44(auVar95._4_4_ * fVar144,
                                                              auVar95._0_4_ * fVar169))));
              auVar81._4_4_ = uStack_47c;
              auVar81._0_4_ = local_480;
              auVar81._8_4_ = uStack_478;
              auVar81._12_4_ = uStack_474;
              auVar81._16_4_ = uStack_470;
              auVar81._20_4_ = uStack_46c;
              auVar81._24_4_ = uStack_468;
              auVar81._28_4_ = uStack_464;
              uVar146 = vcmpps_avx512vl(auVar102,auVar81,0xd);
              uVar145 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar32._4_4_ = uVar145;
              auVar32._0_4_ = uVar145;
              auVar32._8_4_ = uVar145;
              auVar32._12_4_ = uVar145;
              auVar32._16_4_ = uVar145;
              auVar32._20_4_ = uVar145;
              auVar32._24_4_ = uVar145;
              auVar32._28_4_ = uVar145;
              uVar24 = vcmpps_avx512vl(auVar102,auVar32,2);
              local_370 = (byte)uVar146 & (byte)uVar24 & local_370;
              if (local_370 == 0) goto LAB_01f279a0;
              uVar146 = vcmpps_avx512vl(auVar103,auVar100,4);
              if ((local_370 & (byte)uVar146) == 0) {
                local_370 = 0;
              }
              else {
                local_370 = local_370 & (byte)uVar146;
                fVar177 = auVar107._0_4_ * fVar169;
                fVar178 = auVar107._4_4_ * fVar144;
                auVar70._4_4_ = fVar178;
                auVar70._0_4_ = fVar177;
                fVar160 = auVar107._8_4_ * fVar168;
                auVar70._8_4_ = fVar160;
                fVar167 = auVar107._12_4_ * fVar176;
                auVar70._12_4_ = fVar167;
                fVar92 = auVar107._16_4_ * 0.0;
                auVar70._16_4_ = fVar92;
                fVar159 = auVar107._20_4_ * 0.0;
                auVar70._20_4_ = fVar159;
                fVar137 = auVar107._24_4_ * 0.0;
                auVar70._24_4_ = fVar137;
                auVar70._28_4_ = auVar107._28_4_;
                fVar169 = auVar101._0_4_ * fVar169;
                fVar144 = auVar101._4_4_ * fVar144;
                auVar71._4_4_ = fVar144;
                auVar71._0_4_ = fVar169;
                fVar168 = auVar101._8_4_ * fVar168;
                auVar71._8_4_ = fVar168;
                fVar176 = auVar101._12_4_ * fVar176;
                auVar71._12_4_ = fVar176;
                fVar138 = auVar101._16_4_ * 0.0;
                auVar71._16_4_ = fVar138;
                fVar139 = auVar101._20_4_ * 0.0;
                auVar71._20_4_ = fVar139;
                fVar140 = auVar101._24_4_ * 0.0;
                auVar71._24_4_ = fVar140;
                auVar71._28_4_ = auVar101._28_4_;
                auVar186._8_4_ = 0x3f800000;
                auVar186._0_8_ = &DAT_3f8000003f800000;
                auVar186._12_4_ = 0x3f800000;
                auVar186._16_4_ = 0x3f800000;
                auVar186._20_4_ = 0x3f800000;
                auVar186._24_4_ = 0x3f800000;
                auVar186._28_4_ = 0x3f800000;
                auVar103 = vsubps_avx(auVar186,auVar70);
                local_660._0_4_ =
                     (uint)(bVar84 & 1) * (int)fVar177 | (uint)!(bool)(bVar84 & 1) * auVar103._0_4_;
                bVar17 = (bool)((byte)(uVar82 >> 1) & 1);
                local_660._4_4_ = (uint)bVar17 * (int)fVar178 | (uint)!bVar17 * auVar103._4_4_;
                bVar17 = (bool)((byte)(uVar82 >> 2) & 1);
                local_660._8_4_ = (uint)bVar17 * (int)fVar160 | (uint)!bVar17 * auVar103._8_4_;
                bVar17 = (bool)((byte)(uVar82 >> 3) & 1);
                local_660._12_4_ = (uint)bVar17 * (int)fVar167 | (uint)!bVar17 * auVar103._12_4_;
                bVar17 = (bool)((byte)(uVar82 >> 4) & 1);
                local_660._16_4_ = (uint)bVar17 * (int)fVar92 | (uint)!bVar17 * auVar103._16_4_;
                bVar17 = (bool)((byte)(uVar82 >> 5) & 1);
                local_660._20_4_ = (uint)bVar17 * (int)fVar159 | (uint)!bVar17 * auVar103._20_4_;
                bVar17 = (bool)((byte)(uVar82 >> 6) & 1);
                local_660._24_4_ = (uint)bVar17 * (int)fVar137 | (uint)!bVar17 * auVar103._24_4_;
                bVar17 = SUB81(uVar82 >> 7,0);
                local_660._28_4_ = (uint)bVar17 * auVar107._28_4_ | (uint)!bVar17 * auVar103._28_4_;
                auVar103 = vsubps_avx(auVar186,auVar71);
                bVar17 = (bool)((byte)(uVar82 >> 1) & 1);
                bVar18 = (bool)((byte)(uVar82 >> 2) & 1);
                bVar19 = (bool)((byte)(uVar82 >> 3) & 1);
                bVar20 = (bool)((byte)(uVar82 >> 4) & 1);
                bVar21 = (bool)((byte)(uVar82 >> 5) & 1);
                bVar22 = (bool)((byte)(uVar82 >> 6) & 1);
                bVar23 = SUB81(uVar82 >> 7,0);
                local_300._4_4_ = (uint)bVar17 * (int)fVar144 | (uint)!bVar17 * auVar103._4_4_;
                local_300._0_4_ =
                     (uint)(bVar84 & 1) * (int)fVar169 | (uint)!(bool)(bVar84 & 1) * auVar103._0_4_;
                local_300._8_4_ = (uint)bVar18 * (int)fVar168 | (uint)!bVar18 * auVar103._8_4_;
                local_300._12_4_ = (uint)bVar19 * (int)fVar176 | (uint)!bVar19 * auVar103._12_4_;
                local_300._16_4_ = (uint)bVar20 * (int)fVar138 | (uint)!bVar20 * auVar103._16_4_;
                local_300._20_4_ = (uint)bVar21 * (int)fVar139 | (uint)!bVar21 * auVar103._20_4_;
                local_300._24_4_ = (uint)bVar22 * (int)fVar140 | (uint)!bVar22 * auVar103._24_4_;
                local_300._28_4_ = (uint)bVar23 * auVar101._28_4_ | (uint)!bVar23 * auVar103._28_4_;
                local_680 = auVar102;
              }
            }
            auVar215 = ZEXT3264(local_700);
            if (local_370 != 0) {
              auVar103 = vsubps_avx(ZEXT1632(auVar94),auVar109);
              auVar93 = vfmadd213ps_fma(auVar103,local_660,auVar109);
              uVar145 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar33._4_4_ = uVar145;
              auVar33._0_4_ = uVar145;
              auVar33._8_4_ = uVar145;
              auVar33._12_4_ = uVar145;
              auVar33._16_4_ = uVar145;
              auVar33._20_4_ = uVar145;
              auVar33._24_4_ = uVar145;
              auVar33._28_4_ = uVar145;
              auVar103 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar93._12_4_ + auVar93._12_4_,
                                                            CONCAT48(auVar93._8_4_ + auVar93._8_4_,
                                                                     CONCAT44(auVar93._4_4_ +
                                                                              auVar93._4_4_,
                                                                              auVar93._0_4_ +
                                                                              auVar93._0_4_)))),
                                         auVar33);
              uVar146 = vcmpps_avx512vl(local_680,auVar103,6);
              local_370 = local_370 & (byte)uVar146;
              if (local_370 != 0) {
                auVar151._8_4_ = 0xbf800000;
                auVar151._0_8_ = 0xbf800000bf800000;
                auVar151._12_4_ = 0xbf800000;
                auVar151._16_4_ = 0xbf800000;
                auVar151._20_4_ = 0xbf800000;
                auVar151._24_4_ = 0xbf800000;
                auVar151._28_4_ = 0xbf800000;
                auVar34._8_4_ = 0x40000000;
                auVar34._0_8_ = 0x4000000040000000;
                auVar34._12_4_ = 0x40000000;
                auVar34._16_4_ = 0x40000000;
                auVar34._20_4_ = 0x40000000;
                auVar34._24_4_ = 0x40000000;
                auVar34._28_4_ = 0x40000000;
                local_400 = vfmadd132ps_avx512vl(local_300,auVar151,auVar34);
                local_300 = local_400;
                auVar103 = local_300;
                local_3c0 = (undefined4)lVar91;
                local_3b0 = local_750._0_8_;
                uStack_3a8 = local_750._8_8_;
                local_3a0 = local_510._0_8_;
                uStack_398 = local_510._8_8_;
                local_390 = local_520._0_8_;
                uStack_388 = local_520._8_8_;
                local_380 = local_530._0_8_;
                uStack_378 = local_530._8_8_;
                pGVar13 = (context->scene->geometries).items[uVar90].ptr;
                if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar84 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar84 = 1, pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_180 = vmovdqa64_avx512vl(auVar200._0_32_);
                  auVar93 = vcvtsi2ss_avx512f(auVar206._0_16_,local_3c0);
                  fVar169 = auVar93._0_4_;
                  local_360[0] = (fVar169 + local_660._0_4_ + 0.0) * (float)local_4a0;
                  local_360[1] = (fVar169 + local_660._4_4_ + 1.0) * local_4a0._4_4_;
                  local_360[2] = (fVar169 + local_660._8_4_ + 2.0) * fStack_498;
                  local_360[3] = (fVar169 + local_660._12_4_ + 3.0) * fStack_494;
                  fStack_350 = (fVar169 + local_660._16_4_ + 4.0) * fStack_490;
                  fStack_34c = (fVar169 + local_660._20_4_ + 5.0) * fStack_48c;
                  fStack_348 = (fVar169 + local_660._24_4_ + 6.0) * fStack_488;
                  fStack_344 = fVar169 + local_660._28_4_ + 7.0;
                  local_300._0_8_ = local_400._0_8_;
                  local_300._8_8_ = local_400._8_8_;
                  local_300._16_8_ = local_400._16_8_;
                  local_300._24_8_ = local_400._24_8_;
                  local_340 = local_300._0_8_;
                  uStack_338 = local_300._8_8_;
                  uStack_330 = local_300._16_8_;
                  uStack_328 = local_300._24_8_;
                  local_320 = local_680;
                  local_6a0 = local_510._0_8_;
                  uStack_698 = local_510._8_8_;
                  uVar82 = 0;
                  uVar86 = (ulong)local_370;
                  for (uVar88 = uVar86; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000
                      ) {
                    uVar82 = uVar82 + 1;
                  }
                  local_6b0 = local_520._0_4_;
                  fStack_6ac = local_520._4_4_;
                  fStack_6a8 = local_520._8_4_;
                  fStack_6a4 = local_520._12_4_;
                  _local_770 = local_530;
                  local_4e0._0_4_ = 1;
                  local_420 = local_660;
                  local_3e0 = local_680;
                  local_3bc = iVar12;
                  local_300 = auVar103;
                  do {
                    local_760 = *(undefined4 *)(ray + k * 4 + 0x100);
                    fVar169 = local_360[uVar82];
                    auVar154._4_4_ = fVar169;
                    auVar154._0_4_ = fVar169;
                    auVar154._8_4_ = fVar169;
                    auVar154._12_4_ = fVar169;
                    local_240._16_4_ = fVar169;
                    local_240._0_16_ = auVar154;
                    local_240._20_4_ = fVar169;
                    local_240._24_4_ = fVar169;
                    local_240._28_4_ = fVar169;
                    local_220 = *(undefined4 *)((long)&local_340 + uVar82 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar82 * 4);
                    local_7a0.context = context->user;
                    fVar144 = 1.0 - fVar169;
                    auVar6 = vfnmadd231ss_fma(ZEXT416((uint)(fVar169 * (fVar144 + fVar144))),
                                              ZEXT416((uint)fVar144),ZEXT416((uint)fVar144));
                    auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar154,
                                              ZEXT416(0xc0a00000));
                    auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar169 * fVar169 * 3.0)),
                                              ZEXT416((uint)(fVar169 + fVar169)),auVar93);
                    auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar154,
                                              ZEXT416(0x40000000));
                    auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * fVar144 * -3.0)),
                                              ZEXT416((uint)(fVar144 + fVar144)),auVar93);
                    auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar169 * fVar169)),auVar154,
                                              ZEXT416((uint)(fVar144 * -2.0)));
                    fVar169 = auVar6._0_4_ * 0.5;
                    fVar144 = auVar94._0_4_ * 0.5;
                    fVar168 = auVar93._0_4_ * 0.5;
                    fVar176 = auVar95._0_4_ * 0.5;
                    auVar163._0_4_ = fVar176 * (float)local_770._0_4_;
                    auVar163._4_4_ = fVar176 * (float)local_770._4_4_;
                    auVar163._8_4_ = fVar176 * fStack_768;
                    auVar163._12_4_ = fVar176 * fStack_764;
                    auVar180._4_4_ = fVar168;
                    auVar180._0_4_ = fVar168;
                    auVar180._8_4_ = fVar168;
                    auVar180._12_4_ = fVar168;
                    auVar77._4_4_ = fStack_6ac;
                    auVar77._0_4_ = local_6b0;
                    auVar77._8_4_ = fStack_6a8;
                    auVar77._12_4_ = fStack_6a4;
                    auVar93 = vfmadd132ps_fma(auVar180,auVar163,auVar77);
                    auVar164._4_4_ = fVar144;
                    auVar164._0_4_ = fVar144;
                    auVar164._8_4_ = fVar144;
                    auVar164._12_4_ = fVar144;
                    auVar79._8_8_ = uStack_698;
                    auVar79._0_8_ = local_6a0;
                    auVar93 = vfmadd132ps_fma(auVar164,auVar93,auVar79);
                    auVar148._4_4_ = fVar169;
                    auVar148._0_4_ = fVar169;
                    auVar148._8_4_ = fVar169;
                    auVar148._12_4_ = fVar169;
                    auVar93 = vfmadd132ps_fma(auVar148,auVar93,local_750);
                    local_2a0 = auVar93._0_4_;
                    auVar175._8_4_ = 1;
                    auVar175._0_8_ = 0x100000001;
                    auVar175._12_4_ = 1;
                    auVar175._16_4_ = 1;
                    auVar175._20_4_ = 1;
                    auVar175._24_4_ = 1;
                    auVar175._28_4_ = 1;
                    local_280 = vpermps_avx2(auVar175,ZEXT1632(auVar93));
                    auVar183._8_4_ = 2;
                    auVar183._0_8_ = 0x200000002;
                    auVar183._12_4_ = 2;
                    auVar183._16_4_ = 2;
                    auVar183._20_4_ = 2;
                    auVar183._24_4_ = 2;
                    auVar183._28_4_ = 2;
                    local_260 = vpermps_avx2(auVar183,ZEXT1632(auVar93));
                    uStack_29c = local_2a0;
                    uStack_298 = local_2a0;
                    uStack_294 = local_2a0;
                    uStack_290 = local_2a0;
                    uStack_28c = local_2a0;
                    uStack_288 = local_2a0;
                    uStack_284 = local_2a0;
                    uStack_21c = local_220;
                    uStack_218 = local_220;
                    uStack_214 = local_220;
                    uStack_210 = local_220;
                    uStack_20c = local_220;
                    uStack_208 = local_220;
                    uStack_204 = local_220;
                    local_200 = local_440._0_8_;
                    uStack_1f8 = local_440._8_8_;
                    uStack_1f0 = local_440._16_8_;
                    uStack_1e8 = local_440._24_8_;
                    local_1e0 = local_460;
                    vpcmpeqd_avx2(local_460,local_460);
                    local_1c0 = (local_7a0.context)->instID[0];
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_1a0 = (local_7a0.context)->instPrimID[0];
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_6e0 = local_2c0._0_8_;
                    uStack_6d8 = local_2c0._8_8_;
                    uStack_6d0 = local_2c0._16_8_;
                    uStack_6c8 = local_2c0._24_8_;
                    local_7a0.valid = (int *)&local_6e0;
                    local_7a0.geometryUserPtr = pGVar13->userPtr;
                    local_7a0.hit = (RTCHitN *)&local_2a0;
                    local_7a0.N = 8;
                    pRVar83 = (RayK<8> *)pGVar13->occlusionFilterN;
                    local_4c0._0_8_ = uVar82;
                    uVar88 = uVar82;
                    local_7a0.ray = (RTCRayN *)ray;
                    if (pRVar83 != (RayK<8> *)0x0) {
                      pRVar83 = (RayK<8> *)(*(code *)pRVar83)(&local_7a0);
                      uVar88 = local_4c0._0_8_;
                    }
                    auVar75._8_8_ = uStack_6d8;
                    auVar75._0_8_ = local_6e0;
                    auVar75._16_8_ = uStack_6d0;
                    auVar75._24_8_ = uStack_6c8;
                    if (auVar75 != (undefined1  [32])0x0) {
                      p_Var16 = context->args->filter;
                      if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var16)(&local_7a0);
                        uVar88 = local_4c0._0_8_;
                      }
                      auVar93 = auVar211._0_16_;
                      auVar76._8_8_ = uStack_6d8;
                      auVar76._0_8_ = local_6e0;
                      auVar76._16_8_ = uStack_6d0;
                      auVar76._24_8_ = uStack_6c8;
                      uVar82 = vptestmd_avx512vl(auVar76,auVar76);
                      auVar103 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar17 = (bool)((byte)uVar82 & 1);
                      auVar136._0_4_ =
                           (uint)bVar17 * auVar103._0_4_ |
                           (uint)!bVar17 * *(int *)(local_7a0.ray + 0x100);
                      bVar17 = (bool)((byte)(uVar82 >> 1) & 1);
                      auVar136._4_4_ =
                           (uint)bVar17 * auVar103._4_4_ |
                           (uint)!bVar17 * *(int *)(local_7a0.ray + 0x104);
                      bVar17 = (bool)((byte)(uVar82 >> 2) & 1);
                      auVar136._8_4_ =
                           (uint)bVar17 * auVar103._8_4_ |
                           (uint)!bVar17 * *(int *)(local_7a0.ray + 0x108);
                      bVar17 = (bool)((byte)(uVar82 >> 3) & 1);
                      auVar136._12_4_ =
                           (uint)bVar17 * auVar103._12_4_ |
                           (uint)!bVar17 * *(int *)(local_7a0.ray + 0x10c);
                      bVar17 = (bool)((byte)(uVar82 >> 4) & 1);
                      auVar136._16_4_ =
                           (uint)bVar17 * auVar103._16_4_ |
                           (uint)!bVar17 * *(int *)(local_7a0.ray + 0x110);
                      bVar17 = (bool)((byte)(uVar82 >> 5) & 1);
                      auVar136._20_4_ =
                           (uint)bVar17 * auVar103._20_4_ |
                           (uint)!bVar17 * *(int *)(local_7a0.ray + 0x114);
                      bVar17 = (bool)((byte)(uVar82 >> 6) & 1);
                      auVar136._24_4_ =
                           (uint)bVar17 * auVar103._24_4_ |
                           (uint)!bVar17 * *(int *)(local_7a0.ray + 0x118);
                      bVar17 = SUB81(uVar82 >> 7,0);
                      auVar136._28_4_ =
                           (uint)bVar17 * auVar103._28_4_ |
                           (uint)!bVar17 * *(int *)(local_7a0.ray + 0x11c);
                      *(undefined1 (*) [32])(local_7a0.ray + 0x100) = auVar136;
                      pRVar83 = (RayK<8> *)local_7a0.ray;
                      if (auVar76 != (undefined1  [32])0x0) break;
                    }
                    auVar93 = auVar211._0_16_;
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_760;
                    uVar82 = 0;
                    uVar86 = uVar86 ^ 1L << (uVar88 & 0x3f);
                    for (uVar88 = uVar86; (uVar88 & 1) == 0;
                        uVar88 = uVar88 >> 1 | 0x8000000000000000) {
                      uVar82 = uVar82 + 1;
                    }
                    local_4e0._0_4_ = (int)CONCAT71((int7)((ulong)pRVar83 >> 8),uVar86 != 0);
                  } while (uVar86 != 0);
                  bVar84 = local_4e0[0] & 1;
                  auVar93 = vxorps_avx512vl(auVar93,auVar93);
                  auVar211 = ZEXT1664(auVar93);
                  auVar207 = ZEXT3264(local_560);
                  auVar208 = ZEXT3264(local_500);
                  auVar209 = ZEXT3264(local_580);
                  auVar205 = ZEXT3264(local_5a0);
                  auVar215 = ZEXT3264(local_700);
                  auVar212 = ZEXT3264(local_5e0);
                  auVar213 = ZEXT3264(local_600);
                  auVar214 = ZEXT3264(local_620);
                  auVar103 = vmovdqa64_avx512vl(local_180);
                  auVar200 = ZEXT3264(auVar103);
                }
                bVar89 = (bool)(bVar89 | bVar84);
              }
            }
          }
          lVar91 = lVar91 + 8;
          auVar206 = auVar205;
        } while ((int)lVar91 < iVar12);
      }
      if (bVar89 != false) {
        return local_7d9;
      }
      uVar145 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar30._4_4_ = uVar145;
      auVar30._0_4_ = uVar145;
      auVar30._8_4_ = uVar145;
      auVar30._12_4_ = uVar145;
      auVar30._16_4_ = uVar145;
      auVar30._20_4_ = uVar145;
      auVar30._24_4_ = uVar145;
      auVar30._28_4_ = uVar145;
      uVar146 = vcmpps_avx512vl(local_80,auVar30,2);
      uVar90 = (uint)uVar85 & (uint)uVar85 + 0xff & (uint)uVar146;
      uVar85 = (ulong)uVar90;
      local_7d9 = uVar90 != 0;
    } while (local_7d9);
  }
  return local_7d9;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }